

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined8 uVar30;
  int iVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  bool bVar76;
  byte bVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  Geometry *geometry;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  long lVar82;
  long lVar83;
  byte bVar84;
  float fVar85;
  float fVar134;
  float fVar136;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar90 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar91 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar140;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  float fVar141;
  undefined4 uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar148 [64];
  float fVar151;
  undefined8 uVar152;
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  long local_730;
  ulong local_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_670 [8];
  float fStack_668;
  float fStack_664;
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [64];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined4 uStack_464;
  undefined1 auStack_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar78 = (ulong)(byte)prim[1];
  fVar151 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar90 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar154 = vsubps_avx(auVar29,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar156 = fVar151 * auVar154._0_4_;
  fVar141 = fVar151 * auVar90._0_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar29);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar88);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar89);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar87);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 * 0xc + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar78 * 0xd + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x12 + 6);
  auVar109 = vpmovsxbd_avx2(auVar8);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x13 + 6);
  auVar108 = vpmovsxbd_avx2(auVar9);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 * 0x14 + 6);
  auVar103 = vpmovsxbd_avx2(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar103);
  auVar179._4_4_ = fVar141;
  auVar179._0_4_ = fVar141;
  auVar179._8_4_ = fVar141;
  auVar179._12_4_ = fVar141;
  auVar179._16_4_ = fVar141;
  auVar179._20_4_ = fVar141;
  auVar179._24_4_ = fVar141;
  auVar179._28_4_ = fVar141;
  auVar181._8_4_ = 1;
  auVar181._0_8_ = 0x100000001;
  auVar181._12_4_ = 1;
  auVar181._16_4_ = 1;
  auVar181._20_4_ = 1;
  auVar181._24_4_ = 1;
  auVar181._28_4_ = 1;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar151 * auVar90._12_4_,
                               CONCAT48(fVar151 * auVar90._8_4_,
                                        CONCAT44(fVar151 * auVar90._4_4_,fVar141))));
  auVar94 = vpermps_avx2(auVar181,auVar95);
  auVar93 = vpermps_avx512vl(auVar92,auVar95);
  fVar141 = auVar93._0_4_;
  auVar148._0_4_ = fVar141 * auVar97._0_4_;
  fVar149 = auVar93._4_4_;
  auVar148._4_4_ = fVar149 * auVar97._4_4_;
  fVar150 = auVar93._8_4_;
  auVar148._8_4_ = fVar150 * auVar97._8_4_;
  fVar170 = auVar93._12_4_;
  auVar148._12_4_ = fVar170 * auVar97._12_4_;
  fVar172 = auVar93._16_4_;
  auVar148._16_4_ = fVar172 * auVar97._16_4_;
  fVar169 = auVar93._20_4_;
  auVar148._20_4_ = fVar169 * auVar97._20_4_;
  fVar171 = auVar93._24_4_;
  auVar148._28_36_ = in_ZMM4._28_36_;
  auVar148._24_4_ = fVar171 * auVar97._24_4_;
  auVar95._4_4_ = auVar101._4_4_ * fVar149;
  auVar95._0_4_ = auVar101._0_4_ * fVar141;
  auVar95._8_4_ = auVar101._8_4_ * fVar150;
  auVar95._12_4_ = auVar101._12_4_ * fVar170;
  auVar95._16_4_ = auVar101._16_4_ * fVar172;
  auVar95._20_4_ = auVar101._20_4_ * fVar169;
  auVar95._24_4_ = auVar101._24_4_ * fVar171;
  auVar95._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar102._4_4_ * fVar149;
  auVar103._0_4_ = auVar102._0_4_ * fVar141;
  auVar103._8_4_ = auVar102._8_4_ * fVar150;
  auVar103._12_4_ = auVar102._12_4_ * fVar170;
  auVar103._16_4_ = auVar102._16_4_ * fVar172;
  auVar103._20_4_ = auVar102._20_4_ * fVar169;
  auVar103._24_4_ = auVar102._24_4_ * fVar171;
  auVar103._28_4_ = auVar93._28_4_;
  auVar29 = vfmadd231ps_fma(auVar148._0_32_,auVar94,auVar96);
  auVar88 = vfmadd231ps_fma(auVar95,auVar94,auVar99);
  auVar89 = vfmadd231ps_fma(auVar103,auVar108,auVar94);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar179,auVar100);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar179,auVar98);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,auVar179);
  auVar180._4_4_ = fVar156;
  auVar180._0_4_ = fVar156;
  auVar180._8_4_ = fVar156;
  auVar180._12_4_ = fVar156;
  auVar180._16_4_ = fVar156;
  auVar180._20_4_ = fVar156;
  auVar180._24_4_ = fVar156;
  auVar180._28_4_ = fVar156;
  auVar94 = ZEXT1632(CONCAT412(fVar151 * auVar154._12_4_,
                               CONCAT48(fVar151 * auVar154._8_4_,
                                        CONCAT44(fVar151 * auVar154._4_4_,fVar156))));
  auVar103 = vpermps_avx2(auVar181,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar97);
  auVar105._0_4_ = auVar94._0_4_ * auVar101._0_4_;
  auVar105._4_4_ = auVar94._4_4_ * auVar101._4_4_;
  auVar105._8_4_ = auVar94._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar94._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * auVar101._16_4_;
  auVar105._20_4_ = auVar94._20_4_ * auVar101._20_4_;
  auVar105._24_4_ = auVar94._24_4_ * auVar101._24_4_;
  auVar105._28_4_ = 0;
  auVar101._4_4_ = auVar94._4_4_ * auVar102._4_4_;
  auVar101._0_4_ = auVar94._0_4_ * auVar102._0_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar102._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar102._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * auVar102._16_4_;
  auVar101._20_4_ = auVar94._20_4_ * auVar102._20_4_;
  auVar101._24_4_ = auVar94._24_4_ * auVar102._24_4_;
  auVar101._28_4_ = auVar97._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar96);
  auVar87 = vfmadd231ps_fma(auVar105,auVar103,auVar99);
  auVar86 = vfmadd231ps_fma(auVar101,auVar103,auVar108);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar180,auVar100);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar180,auVar98);
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar180,auVar109);
  auVar100 = vandps_avx(ZEXT1632(auVar29),auVar121);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar100,auVar107,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar94._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar29._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar29._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar29._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar29._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar88),auVar121);
  uVar79 = vcmpps_avx512vl(auVar100,auVar107,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar88._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar88._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar88._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar88._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar89),auVar121);
  uVar79 = vcmpps_avx512vl(auVar100,auVar107,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar100._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar99 = vfnmadd213ps_avx512vl(auVar94,auVar97,auVar98);
  auVar29 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar92);
  auVar99 = vfnmadd213ps_avx512vl(auVar92,auVar97,auVar98);
  auVar88 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar100);
  auVar100 = vfnmadd213ps_avx512vl(auVar100,auVar97,auVar98);
  auVar89 = vfmadd132ps_fma(auVar100,auVar97,auVar97);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx512vl(auVar100,auVar96);
  auVar109._4_4_ = auVar29._4_4_ * auVar100._4_4_;
  auVar109._0_4_ = auVar29._0_4_ * auVar100._0_4_;
  auVar109._8_4_ = auVar29._8_4_ * auVar100._8_4_;
  auVar109._12_4_ = auVar29._12_4_ * auVar100._12_4_;
  auVar109._16_4_ = auVar100._16_4_ * 0.0;
  auVar109._20_4_ = auVar100._20_4_ * 0.0;
  auVar109._24_4_ = auVar100._24_4_ * 0.0;
  auVar109._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx512vl(auVar100,auVar96);
  auVar106._0_4_ = auVar29._0_4_ * auVar100._0_4_;
  auVar106._4_4_ = auVar29._4_4_ * auVar100._4_4_;
  auVar106._8_4_ = auVar29._8_4_ * auVar100._8_4_;
  auVar106._12_4_ = auVar29._12_4_ * auVar100._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xe + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar108._4_4_ = auVar88._4_4_ * auVar100._4_4_;
  auVar108._0_4_ = auVar88._0_4_ * auVar100._0_4_;
  auVar108._8_4_ = auVar88._8_4_ * auVar100._8_4_;
  auVar108._12_4_ = auVar88._12_4_ * auVar100._12_4_;
  auVar108._16_4_ = auVar100._16_4_ * 0.0;
  auVar108._20_4_ = auVar100._20_4_ * 0.0;
  auVar108._24_4_ = auVar100._24_4_ * 0.0;
  auVar108._28_4_ = auVar100._28_4_;
  auVar101 = vpbroadcastd_avx512vl();
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar104._0_4_ = auVar88._0_4_ * auVar100._0_4_;
  auVar104._4_4_ = auVar88._4_4_ * auVar100._4_4_;
  auVar104._8_4_ = auVar88._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar88._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x15 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar102._4_4_ = auVar100._4_4_ * auVar89._4_4_;
  auVar102._0_4_ = auVar100._0_4_ * auVar89._0_4_;
  auVar102._8_4_ = auVar100._8_4_ * auVar89._8_4_;
  auVar102._12_4_ = auVar100._12_4_ * auVar89._12_4_;
  auVar102._16_4_ = auVar100._16_4_ * 0.0;
  auVar102._20_4_ = auVar100._20_4_ * 0.0;
  auVar102._24_4_ = auVar100._24_4_ * 0.0;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar93._0_4_ = auVar89._0_4_ * auVar100._0_4_;
  auVar93._4_4_ = auVar89._4_4_ * auVar100._4_4_;
  auVar93._8_4_ = auVar89._8_4_ * auVar100._8_4_;
  auVar93._12_4_ = auVar89._12_4_ * auVar100._12_4_;
  auVar93._16_4_ = auVar100._16_4_ * 0.0;
  auVar93._20_4_ = auVar100._20_4_ * 0.0;
  auVar93._24_4_ = auVar100._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar109,auVar106);
  auVar96 = vpminsd_avx2(auVar108,auVar104);
  auVar100 = vmaxps_avx(auVar100,auVar96);
  auVar96 = vpminsd_avx2(auVar102,auVar93);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar97._4_4_ = uVar142;
  auVar97._0_4_ = uVar142;
  auVar97._8_4_ = uVar142;
  auVar97._12_4_ = uVar142;
  auVar97._16_4_ = uVar142;
  auVar97._20_4_ = uVar142;
  auVar97._24_4_ = uVar142;
  auVar97._28_4_ = uVar142;
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar100 = vmaxps_avx(auVar100,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_360 = vmulps_avx512vl(auVar100,auVar96);
  auVar100 = vpmaxsd_avx2(auVar109,auVar106);
  auVar96 = vpmaxsd_avx2(auVar108,auVar104);
  auVar100 = vminps_avx(auVar100,auVar96);
  auVar96 = vpmaxsd_avx2(auVar102,auVar93);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar98._4_4_ = uVar142;
  auVar98._0_4_ = uVar142;
  auVar98._8_4_ = uVar142;
  auVar98._12_4_ = uVar142;
  auVar98._16_4_ = uVar142;
  auVar98._20_4_ = uVar142;
  auVar98._24_4_ = uVar142;
  auVar98._28_4_ = uVar142;
  auVar96 = vminps_avx512vl(auVar96,auVar98);
  auVar100 = vminps_avx(auVar100,auVar96);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar99);
  uVar152 = vcmpps_avx512vl(local_360,auVar100,2);
  uVar30 = vpcmpgtd_avx512vl(auVar101,_DAT_01fb4ba0);
  local_728 = (ulong)(byte)((byte)uVar152 & (byte)uVar30);
  auVar148 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar148);
  while (local_728 != 0) {
    iVar31 = 0;
    for (uVar79 = local_728; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      iVar31 = iVar31 + 1;
    }
    uVar81 = local_728 - 1 & local_728;
    uVar79 = (ulong)(uint)(iVar31 << 6);
    uVar11 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar11].ptr;
    auVar29 = *(undefined1 (*) [16])(prim + uVar79 + uVar78 * 0x19 + 0x16);
    if (uVar81 != 0) {
      uVar80 = uVar81 - 1 & uVar81;
      for (uVar32 = uVar81; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      }
      if (uVar80 != 0) {
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_7d0 = *(undefined1 (*) [16])(prim + uVar79 + uVar78 * 0x19 + 0x26);
    local_7e0 = *(undefined1 (*) [16])(prim + uVar79 + uVar78 * 0x19 + 0x36);
    _local_670 = *(undefined1 (*) [16])(prim + uVar79 + uVar78 * 0x19 + 0x46);
    iVar31 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar87 = vsubps_avx(auVar29,auVar88);
    uVar142 = auVar87._0_4_;
    auVar90._4_4_ = uVar142;
    auVar90._0_4_ = uVar142;
    auVar90._8_4_ = uVar142;
    auVar90._12_4_ = uVar142;
    auVar89 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar151 = pre->ray_space[k].vz.field_0.m128[0];
    fVar141 = pre->ray_space[k].vz.field_0.m128[1];
    fVar149 = pre->ray_space[k].vz.field_0.m128[2];
    fVar150 = pre->ray_space[k].vz.field_0.m128[3];
    auVar91._0_4_ = fVar151 * auVar87._0_4_;
    auVar91._4_4_ = fVar141 * auVar87._4_4_;
    auVar91._8_4_ = fVar149 * auVar87._8_4_;
    auVar91._12_4_ = fVar150 * auVar87._12_4_;
    auVar89 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar6,auVar89);
    auVar7 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar90);
    auVar89 = vshufps_avx(auVar29,auVar29,0xff);
    auVar86 = vsubps_avx(local_7d0,auVar88);
    uVar142 = auVar86._0_4_;
    auVar157._4_4_ = uVar142;
    auVar157._0_4_ = uVar142;
    auVar157._8_4_ = uVar142;
    auVar157._12_4_ = uVar142;
    auVar87 = vshufps_avx(auVar86,auVar86,0x55);
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar174._0_4_ = fVar151 * auVar86._0_4_;
    auVar174._4_4_ = fVar141 * auVar86._4_4_;
    auVar174._8_4_ = fVar149 * auVar86._8_4_;
    auVar174._12_4_ = fVar150 * auVar86._12_4_;
    auVar87 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar87);
    auVar8 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar157);
    auVar86 = vsubps_avx512vl(local_7e0,auVar88);
    uVar142 = auVar86._0_4_;
    auVar158._4_4_ = uVar142;
    auVar158._0_4_ = uVar142;
    auVar158._8_4_ = uVar142;
    auVar158._12_4_ = uVar142;
    auVar87 = vshufps_avx(auVar86,auVar86,0x55);
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar176._0_4_ = fVar151 * auVar86._0_4_;
    auVar176._4_4_ = fVar141 * auVar86._4_4_;
    auVar176._8_4_ = fVar149 * auVar86._8_4_;
    auVar176._12_4_ = fVar150 * auVar86._12_4_;
    auVar87 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar87);
    auVar86 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar158);
    auVar87 = vsubps_avx512vl(_local_670,auVar88);
    uVar142 = auVar87._0_4_;
    auVar154._4_4_ = uVar142;
    auVar154._0_4_ = uVar142;
    auVar154._8_4_ = uVar142;
    auVar154._12_4_ = uVar142;
    auVar88 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar177._0_4_ = fVar151 * auVar87._0_4_;
    auVar177._4_4_ = fVar141 * auVar87._4_4_;
    auVar177._8_4_ = fVar149 * auVar87._8_4_;
    auVar177._12_4_ = fVar150 * auVar87._12_4_;
    auVar88 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar6,auVar88);
    auVar9 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar154);
    local_730 = (long)iVar31;
    lVar83 = local_730 * 0x44;
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar83);
    local_6c0 = vbroadcastss_avx512vl(auVar7);
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x484);
    auVar147._8_4_ = 1;
    auVar147._0_8_ = 0x100000001;
    auVar147._12_4_ = 1;
    auVar147._16_4_ = 1;
    auVar147._20_4_ = 1;
    auVar147._24_4_ = 1;
    auVar147._28_4_ = 1;
    local_6e0 = vpermps_avx512vl(auVar147,ZEXT1632(auVar7));
    uVar142 = auVar8._0_4_;
    local_700._4_4_ = uVar142;
    local_700._0_4_ = uVar142;
    local_700._8_4_ = uVar142;
    local_700._12_4_ = uVar142;
    local_700._16_4_ = uVar142;
    local_700._20_4_ = uVar142;
    local_700._24_4_ = uVar142;
    local_700._28_4_ = uVar142;
    local_800 = vpermps_avx2(auVar147,ZEXT1632(auVar8));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x908);
    local_820 = vbroadcastss_avx512vl(auVar86);
    local_780 = vpermps_avx512vl(auVar147,ZEXT1632(auVar86));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0xd8c);
    local_7a0 = vbroadcastss_avx512vl(auVar9);
    auVar190 = ZEXT3264(local_7a0);
    local_7c0 = vpermps_avx512vl(auVar147,ZEXT1632(auVar9));
    auVar191 = ZEXT3264(local_7c0);
    auVar99 = vmulps_avx512vl(local_7a0,auVar98);
    auVar101 = vmulps_avx512vl(local_7c0,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_820);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_780);
    auVar88 = vfmadd231ps_fma(auVar99,auVar96,local_700);
    auVar87 = vfmadd231ps_fma(auVar101,auVar96,local_800);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar100,local_6c0);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar83);
    auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x484);
    auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x908);
    auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar100,local_6e0);
    auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0xd8c);
    auVar94 = vmulps_avx512vl(local_7a0,auVar108);
    auVar95 = vmulps_avx512vl(local_7c0,auVar108);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_820);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_780);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_700);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_800);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_6c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,local_6e0);
    auVar92 = vsubps_avx512vl(auVar94,auVar102);
    auVar93 = vsubps_avx512vl(auVar95,auVar103);
    auVar104 = vmulps_avx512vl(auVar103,auVar92);
    auVar105 = vmulps_avx512vl(auVar102,auVar93);
    auVar104 = vsubps_avx512vl(auVar104,auVar105);
    auVar88 = vshufps_avx(local_7d0,local_7d0,0xff);
    uVar152 = auVar89._0_8_;
    local_380._8_8_ = uVar152;
    local_380._0_8_ = uVar152;
    local_380._16_8_ = uVar152;
    local_380._24_8_ = uVar152;
    local_3a0 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx512vl(local_7e0,local_7e0,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx512vl(_local_670,_local_670,0xff);
    uVar152 = auVar88._0_8_;
    register0x000012c8 = uVar152;
    local_3e0 = uVar152;
    register0x000012d0 = uVar152;
    register0x000012d8 = uVar152;
    auVar105 = vmulps_avx512vl(_local_3e0,auVar98);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_3c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_3a0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_380);
    auVar106 = vmulps_avx512vl(_local_3e0,auVar108);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_3c0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_3a0);
    auVar10 = vfmadd231ps_fma(auVar106,auVar99,local_380);
    auVar106 = vmulps_avx512vl(auVar93,auVar93);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar92);
    auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar10));
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    uVar152 = vcmpps_avx512vl(auVar104,auVar106,2);
    auVar88 = vblendps_avx(auVar7,auVar29,8);
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar89 = vandps_avx512vl(auVar88,auVar87);
    auVar88 = vblendps_avx(auVar8,local_7d0,8);
    auVar88 = vandps_avx512vl(auVar88,auVar87);
    auVar89 = vmaxps_avx(auVar89,auVar88);
    auVar88 = vblendps_avx(auVar86,local_7e0,8);
    auVar90 = vandps_avx512vl(auVar88,auVar87);
    auVar88 = vblendps_avx(auVar9,_local_670,8);
    auVar88 = vandps_avx512vl(auVar88,auVar87);
    auVar88 = vmaxps_avx(auVar90,auVar88);
    auVar88 = vmaxps_avx(auVar89,auVar88);
    auVar89 = vmovshdup_avx(auVar88);
    auVar89 = vmaxss_avx(auVar89,auVar88);
    auVar88 = vshufpd_avx(auVar88,auVar88,1);
    auVar87 = vcvtsi2ss_avx512f(local_7e0,iVar31);
    auVar88 = vmaxss_avx(auVar88,auVar89);
    local_4c0._0_16_ = auVar87;
    fVar141 = auVar87._0_4_;
    auVar178._4_4_ = fVar141;
    auVar178._0_4_ = fVar141;
    auVar178._8_4_ = fVar141;
    auVar178._12_4_ = fVar141;
    auVar178._16_4_ = fVar141;
    auVar178._20_4_ = fVar141;
    auVar178._24_4_ = fVar141;
    auVar178._28_4_ = fVar141;
    uVar30 = vcmpps_avx512vl(auVar178,_DAT_01f7b060,0xe);
    bVar84 = (byte)uVar152 & (byte)uVar30;
    fVar151 = auVar88._0_4_ * 4.7683716e-07;
    auVar155._8_4_ = 2;
    auVar155._0_8_ = 0x200000002;
    auVar155._12_4_ = 2;
    auVar155._16_4_ = 2;
    auVar155._20_4_ = 2;
    auVar155._24_4_ = 2;
    auVar155._28_4_ = 2;
    local_400 = vpermps_avx512vl(auVar155,ZEXT1632(auVar7));
    local_420 = vpermps_avx512vl(auVar155,ZEXT1632(auVar8));
    local_440 = vpermps_avx512vl(auVar155,ZEXT1632(auVar86));
    local_760 = vpermps_avx2(auVar155,ZEXT1632(auVar9));
    uVar142 = *(undefined4 *)(ray + k * 4 + 0xc0);
    auVar148 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar148);
    if (bVar84 == 0) {
      bVar76 = false;
      auVar88 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar185 = ZEXT1664(auVar88);
      auVar186 = ZEXT3264(local_6c0);
      auVar187 = ZEXT3264(local_6e0);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar192 = ZEXT3264(auVar100);
      auVar188 = ZEXT3264(local_700);
      auVar184 = ZEXT3264(local_800);
      auVar148 = ZEXT3264(local_820);
      auVar189 = ZEXT3264(local_780);
    }
    else {
      auVar108 = vmulps_avx512vl(local_760,auVar108);
      auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_420,auVar109);
      auVar101 = vfmadd213ps_avx512vl(auVar99,local_400,auVar101);
      auVar98 = vmulps_avx512vl(local_760,auVar98);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_440,auVar98);
      auVar109 = vfmadd213ps_avx512vl(auVar96,local_420,auVar97);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x1210);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x1694);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 + 0x1f9c);
      auVar109 = vfmadd213ps_avx512vl(auVar100,local_400,auVar109);
      auVar100 = vmulps_avx512vl(local_7a0,auVar99);
      auVar108 = vmulps_avx512vl(local_7c0,auVar99);
      auVar99 = vmulps_avx512vl(local_760,auVar99);
      auVar88 = vfmadd231ps_fma(auVar100,auVar98,local_820);
      auVar100 = vfmadd231ps_avx512vl(auVar108,auVar98,local_780);
      auVar98 = vfmadd231ps_avx512vl(auVar99,local_440,auVar98);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar97,local_700);
      auVar184 = ZEXT3264(local_800);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_800);
      auVar108 = vfmadd231ps_avx512vl(auVar98,local_420,auVar97);
      auVar88 = vfmadd231ps_fma(auVar99,auVar96,local_6c0);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar96,local_6e0);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x1210);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x1f9c);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_400,auVar96);
      auVar96 = vmulps_avx512vl(local_7a0,auVar98);
      auVar104 = vmulps_avx512vl(local_7c0,auVar98);
      auVar98 = vmulps_avx512vl(local_760,auVar98);
      auVar106 = vfmadd231ps_avx512vl(auVar96,auVar97,local_820);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar97,local_780);
      auVar97 = vfmadd231ps_avx512vl(auVar98,local_440,auVar97);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 + 0x1694);
      auVar98 = vfmadd231ps_avx512vl(auVar106,auVar96,local_700);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_800);
      auVar96 = vfmadd231ps_avx512vl(auVar97,local_420,auVar96);
      auVar89 = vfmadd231ps_fma(auVar98,auVar100,local_6c0);
      auVar97 = vfmadd231ps_avx512vl(auVar104,auVar100,local_6e0);
      auVar98 = vfmadd231ps_avx512vl(auVar96,local_400,auVar100);
      auVar182._8_4_ = 0x7fffffff;
      auVar182._0_8_ = 0x7fffffff7fffffff;
      auVar182._12_4_ = 0x7fffffff;
      auVar182._16_4_ = 0x7fffffff;
      auVar182._20_4_ = 0x7fffffff;
      auVar182._24_4_ = 0x7fffffff;
      auVar182._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(ZEXT1632(auVar88),auVar182);
      auVar96 = vandps_avx(auVar99,auVar182);
      auVar96 = vmaxps_avx(auVar100,auVar96);
      auVar100 = vandps_avx(auVar108,auVar182);
      auVar100 = vmaxps_avx(auVar96,auVar100);
      auVar108 = vbroadcastss_avx512vl(ZEXT416((uint)fVar151));
      uVar79 = vcmpps_avx512vl(auVar100,auVar108,1);
      bVar76 = (bool)((byte)uVar79 & 1);
      auVar110._0_4_ = (float)((uint)bVar76 * auVar92._0_4_ | (uint)!bVar76 * auVar88._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar76 * auVar92._4_4_ | (uint)!bVar76 * auVar88._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar76 * auVar92._8_4_ | (uint)!bVar76 * auVar88._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar76 * auVar92._12_4_ | (uint)!bVar76 * auVar88._12_4_);
      fVar149 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
      auVar110._16_4_ = fVar149;
      fVar150 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
      auVar110._20_4_ = fVar150;
      fVar170 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
      auVar110._24_4_ = fVar170;
      uVar1 = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
      auVar110._28_4_ = uVar1;
      bVar76 = (bool)((byte)uVar79 & 1);
      auVar111._0_4_ = (float)((uint)bVar76 * auVar93._0_4_ | (uint)!bVar76 * auVar99._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar76 * auVar93._4_4_ | (uint)!bVar76 * auVar99._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar76 * auVar93._8_4_ | (uint)!bVar76 * auVar99._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar76 * auVar93._12_4_ | (uint)!bVar76 * auVar99._12_4_);
      bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar76 * auVar93._16_4_ | (uint)!bVar76 * auVar99._16_4_);
      bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar76 * auVar93._20_4_ | (uint)!bVar76 * auVar99._20_4_);
      bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar76 * auVar93._24_4_ | (uint)!bVar76 * auVar99._24_4_);
      bVar76 = SUB81(uVar79 >> 7,0);
      auVar111._28_4_ = (uint)bVar76 * auVar93._28_4_ | (uint)!bVar76 * auVar99._28_4_;
      auVar100 = vandps_avx(auVar182,ZEXT1632(auVar89));
      auVar96 = vandps_avx(auVar97,auVar182);
      auVar96 = vmaxps_avx(auVar100,auVar96);
      auVar100 = vandps_avx(auVar98,auVar182);
      auVar100 = vmaxps_avx(auVar96,auVar100);
      uVar79 = vcmpps_avx512vl(auVar100,auVar108,1);
      bVar76 = (bool)((byte)uVar79 & 1);
      auVar112._0_4_ = (float)((uint)bVar76 * auVar92._0_4_ | (uint)!bVar76 * auVar89._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar76 * auVar92._4_4_ | (uint)!bVar76 * auVar89._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar76 * auVar92._8_4_ | (uint)!bVar76 * auVar89._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar76 * auVar92._12_4_ | (uint)!bVar76 * auVar89._12_4_);
      fVar171 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
      auVar112._16_4_ = fVar171;
      fVar172 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
      auVar112._20_4_ = fVar172;
      fVar169 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
      auVar112._24_4_ = fVar169;
      auVar112._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
      bVar76 = (bool)((byte)uVar79 & 1);
      auVar113._0_4_ = (float)((uint)bVar76 * auVar93._0_4_ | (uint)!bVar76 * auVar97._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar76 * auVar93._4_4_ | (uint)!bVar76 * auVar97._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar76 * auVar93._8_4_ | (uint)!bVar76 * auVar97._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar76 * auVar93._12_4_ | (uint)!bVar76 * auVar97._12_4_);
      bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar76 * auVar93._16_4_ | (uint)!bVar76 * auVar97._16_4_);
      bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar76 * auVar93._20_4_ | (uint)!bVar76 * auVar97._20_4_);
      bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar76 * auVar93._24_4_ | (uint)!bVar76 * auVar97._24_4_);
      bVar76 = SUB81(uVar79 >> 7,0);
      auVar113._28_4_ = (uint)bVar76 * auVar93._28_4_ | (uint)!bVar76 * auVar97._28_4_;
      auVar91 = vxorps_avx512vl(local_820._0_16_,local_820._0_16_);
      auVar185 = ZEXT1664(auVar91);
      auVar100 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar91));
      auVar88 = vfmadd231ps_fma(auVar100,auVar111,auVar111);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar156 = auVar100._0_4_;
      fVar85 = auVar100._4_4_;
      fVar134 = auVar100._8_4_;
      fVar135 = auVar100._12_4_;
      fVar136 = auVar100._16_4_;
      fVar137 = auVar100._20_4_;
      fVar138 = auVar100._24_4_;
      auVar40._4_4_ = fVar85 * fVar85 * fVar85 * auVar88._4_4_ * -0.5;
      auVar40._0_4_ = fVar156 * fVar156 * fVar156 * auVar88._0_4_ * -0.5;
      auVar40._8_4_ = fVar134 * fVar134 * fVar134 * auVar88._8_4_ * -0.5;
      auVar40._12_4_ = fVar135 * fVar135 * fVar135 * auVar88._12_4_ * -0.5;
      auVar40._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar40._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar40._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar40._28_4_ = 0;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar97 = vfmadd231ps_avx512vl(auVar40,auVar96,auVar100);
      auVar41._4_4_ = auVar111._4_4_ * auVar97._4_4_;
      auVar41._0_4_ = auVar111._0_4_ * auVar97._0_4_;
      auVar41._8_4_ = auVar111._8_4_ * auVar97._8_4_;
      auVar41._12_4_ = auVar111._12_4_ * auVar97._12_4_;
      auVar41._16_4_ = auVar111._16_4_ * auVar97._16_4_;
      auVar41._20_4_ = auVar111._20_4_ * auVar97._20_4_;
      auVar41._24_4_ = auVar111._24_4_ * auVar97._24_4_;
      auVar41._28_4_ = auVar100._28_4_;
      auVar42._4_4_ = auVar97._4_4_ * -auVar110._4_4_;
      auVar42._0_4_ = auVar97._0_4_ * -auVar110._0_4_;
      auVar42._8_4_ = auVar97._8_4_ * -auVar110._8_4_;
      auVar42._12_4_ = auVar97._12_4_ * -auVar110._12_4_;
      auVar42._16_4_ = auVar97._16_4_ * -fVar149;
      auVar42._20_4_ = auVar97._20_4_ * -fVar150;
      auVar42._24_4_ = auVar97._24_4_ * -fVar170;
      auVar42._28_4_ = uVar1 ^ 0x80000000;
      auVar100 = vmulps_avx512vl(auVar97,ZEXT1632(auVar91));
      auVar92 = ZEXT1632(auVar91);
      auVar98 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar92);
      auVar88 = vfmadd231ps_fma(auVar98,auVar113,auVar113);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar149 = auVar98._0_4_;
      fVar150 = auVar98._4_4_;
      fVar170 = auVar98._8_4_;
      fVar156 = auVar98._12_4_;
      fVar85 = auVar98._16_4_;
      fVar134 = auVar98._20_4_;
      fVar135 = auVar98._24_4_;
      auVar43._4_4_ = fVar150 * fVar150 * fVar150 * auVar88._4_4_ * -0.5;
      auVar43._0_4_ = fVar149 * fVar149 * fVar149 * auVar88._0_4_ * -0.5;
      auVar43._8_4_ = fVar170 * fVar170 * fVar170 * auVar88._8_4_ * -0.5;
      auVar43._12_4_ = fVar156 * fVar156 * fVar156 * auVar88._12_4_ * -0.5;
      auVar43._16_4_ = fVar85 * fVar85 * fVar85 * -0.0;
      auVar43._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar43._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar43._28_4_ = 0;
      auVar96 = vfmadd231ps_avx512vl(auVar43,auVar96,auVar98);
      auVar44._4_4_ = auVar113._4_4_ * auVar96._4_4_;
      auVar44._0_4_ = auVar113._0_4_ * auVar96._0_4_;
      auVar44._8_4_ = auVar113._8_4_ * auVar96._8_4_;
      auVar44._12_4_ = auVar113._12_4_ * auVar96._12_4_;
      auVar44._16_4_ = auVar113._16_4_ * auVar96._16_4_;
      auVar44._20_4_ = auVar113._20_4_ * auVar96._20_4_;
      auVar44._24_4_ = auVar113._24_4_ * auVar96._24_4_;
      auVar44._28_4_ = auVar98._28_4_;
      auVar45._4_4_ = -auVar112._4_4_ * auVar96._4_4_;
      auVar45._0_4_ = -auVar112._0_4_ * auVar96._0_4_;
      auVar45._8_4_ = -auVar112._8_4_ * auVar96._8_4_;
      auVar45._12_4_ = -auVar112._12_4_ * auVar96._12_4_;
      auVar45._16_4_ = -fVar171 * auVar96._16_4_;
      auVar45._20_4_ = -fVar172 * auVar96._20_4_;
      auVar45._24_4_ = -fVar169 * auVar96._24_4_;
      auVar45._28_4_ = auVar97._28_4_;
      auVar96 = vmulps_avx512vl(auVar96,auVar92);
      auVar88 = vfmadd213ps_fma(auVar41,auVar105,auVar102);
      auVar89 = vfmadd213ps_fma(auVar42,auVar105,auVar103);
      auVar97 = vfmadd213ps_avx512vl(auVar100,auVar105,auVar109);
      auVar98 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar10),auVar94);
      auVar9 = vfnmadd213ps_fma(auVar41,auVar105,auVar102);
      auVar108 = ZEXT1632(auVar10);
      auVar87 = vfmadd213ps_fma(auVar45,auVar108,auVar95);
      auVar90 = vfnmadd213ps_fma(auVar42,auVar105,auVar103);
      auVar86 = vfmadd213ps_fma(auVar96,auVar108,auVar101);
      auVar99 = vfnmadd231ps_avx512vl(auVar109,auVar105,auVar100);
      auVar154 = vfnmadd213ps_fma(auVar44,auVar108,auVar94);
      auVar157 = vfnmadd213ps_fma(auVar45,auVar108,auVar95);
      auVar158 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar10),auVar96);
      auVar96 = vsubps_avx512vl(auVar98,ZEXT1632(auVar9));
      auVar100 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar90));
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar86),auVar99);
      auVar109 = vmulps_avx512vl(auVar100,auVar99);
      auVar7 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar90),auVar101);
      auVar46._4_4_ = auVar9._4_4_ * auVar101._4_4_;
      auVar46._0_4_ = auVar9._0_4_ * auVar101._0_4_;
      auVar46._8_4_ = auVar9._8_4_ * auVar101._8_4_;
      auVar46._12_4_ = auVar9._12_4_ * auVar101._12_4_;
      auVar46._16_4_ = auVar101._16_4_ * 0.0;
      auVar46._20_4_ = auVar101._20_4_ * 0.0;
      auVar46._24_4_ = auVar101._24_4_ * 0.0;
      auVar46._28_4_ = auVar101._28_4_;
      auVar101 = vfmsub231ps_avx512vl(auVar46,auVar99,auVar96);
      auVar47._4_4_ = auVar90._4_4_ * auVar96._4_4_;
      auVar47._0_4_ = auVar90._0_4_ * auVar96._0_4_;
      auVar47._8_4_ = auVar90._8_4_ * auVar96._8_4_;
      auVar47._12_4_ = auVar90._12_4_ * auVar96._12_4_;
      auVar47._16_4_ = auVar96._16_4_ * 0.0;
      auVar47._20_4_ = auVar96._20_4_ * 0.0;
      auVar47._24_4_ = auVar96._24_4_ * 0.0;
      auVar47._28_4_ = auVar96._28_4_;
      auVar8 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar9),auVar100);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar92,auVar101);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,ZEXT1632(auVar7));
      auVar92 = ZEXT1632(auVar91);
      uVar79 = vcmpps_avx512vl(auVar100,auVar92,2);
      bVar77 = (byte)uVar79;
      fVar156 = (float)((uint)(bVar77 & 1) * auVar88._0_4_ |
                       (uint)!(bool)(bVar77 & 1) * auVar154._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      fVar134 = (float)((uint)bVar76 * auVar88._4_4_ | (uint)!bVar76 * auVar154._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      fVar136 = (float)((uint)bVar76 * auVar88._8_4_ | (uint)!bVar76 * auVar154._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      fVar138 = (float)((uint)bVar76 * auVar88._12_4_ | (uint)!bVar76 * auVar154._12_4_);
      auVar109 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar156))));
      fVar85 = (float)((uint)(bVar77 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar157._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      fVar135 = (float)((uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar157._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      fVar137 = (float)((uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar157._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      fVar139 = (float)((uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar157._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar85))));
      auVar114._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar158._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar158._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar158._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar158._12_4_);
      fVar149 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar97._16_4_);
      auVar114._16_4_ = fVar149;
      fVar150 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar97._20_4_);
      auVar114._20_4_ = fVar150;
      fVar170 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar97._24_4_);
      auVar114._24_4_ = fVar170;
      iVar2 = (uint)(byte)(uVar79 >> 7) * auVar97._28_4_;
      auVar114._28_4_ = iVar2;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar98);
      auVar115._0_4_ = (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar7._0_4_
      ;
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * auVar7._4_4_;
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * auVar7._8_4_;
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * auVar7._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar96._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar96._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar96._24_4_;
      auVar115._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar87));
      auVar116._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar89._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * auVar89._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * auVar89._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * auVar89._12_4_);
      fVar171 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar96._16_4_);
      auVar116._16_4_ = fVar171;
      fVar169 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar96._20_4_);
      auVar116._20_4_ = fVar169;
      fVar172 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar96._24_4_);
      auVar116._24_4_ = fVar172;
      auVar116._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar86));
      auVar117._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar97._0_4_);
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * auVar97._4_4_);
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * auVar97._8_4_);
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * auVar97._12_4_);
      bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar76 * auVar96._16_4_ | (uint)!bVar76 * auVar97._16_4_);
      bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar76 * auVar96._20_4_ | (uint)!bVar76 * auVar97._20_4_);
      bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar76 * auVar96._24_4_ | (uint)!bVar76 * auVar97._24_4_);
      bVar76 = SUB81(uVar79 >> 7,0);
      auVar117._28_4_ = (uint)bVar76 * auVar96._28_4_ | (uint)!bVar76 * auVar97._28_4_;
      auVar118._0_4_ =
           (uint)(bVar77 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar98._0_4_;
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar76 * (int)auVar9._4_4_ | (uint)!bVar76 * auVar98._4_4_;
      bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar76 * (int)auVar9._8_4_ | (uint)!bVar76 * auVar98._8_4_;
      bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar76 * (int)auVar9._12_4_ | (uint)!bVar76 * auVar98._12_4_;
      auVar118._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar98._16_4_;
      auVar118._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar98._20_4_;
      auVar118._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar98._24_4_;
      auVar118._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar98._28_4_;
      bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._0_4_ =
           (uint)(bVar77 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar86._0_4_;
      bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar86._4_4_;
      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar86._8_4_;
      bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar86._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_;
      iVar3 = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
      auVar119._28_4_ = iVar3;
      auVar102 = vsubps_avx512vl(auVar118,auVar109);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar90._12_4_ |
                                              (uint)!bVar16 * auVar87._12_4_,
                                              CONCAT48((uint)bVar15 * (int)auVar90._8_4_ |
                                                       (uint)!bVar15 * auVar87._8_4_,
                                                       CONCAT44((uint)bVar76 * (int)auVar90._4_4_ |
                                                                (uint)!bVar76 * auVar87._4_4_,
                                                                (uint)(bVar77 & 1) *
                                                                (int)auVar90._0_4_ |
                                                                (uint)!(bool)(bVar77 & 1) *
                                                                auVar87._0_4_)))),auVar108);
      auVar97 = vsubps_avx(auVar119,auVar114);
      auVar98 = vsubps_avx(auVar109,auVar115);
      auVar99 = vsubps_avx(auVar108,auVar116);
      auVar101 = vsubps_avx(auVar114,auVar117);
      auVar48._4_4_ = auVar97._4_4_ * fVar134;
      auVar48._0_4_ = auVar97._0_4_ * fVar156;
      auVar48._8_4_ = auVar97._8_4_ * fVar136;
      auVar48._12_4_ = auVar97._12_4_ * fVar138;
      auVar48._16_4_ = auVar97._16_4_ * 0.0;
      auVar48._20_4_ = auVar97._20_4_ * 0.0;
      auVar48._24_4_ = auVar97._24_4_ * 0.0;
      auVar48._28_4_ = iVar3;
      auVar88 = vfmsub231ps_fma(auVar48,auVar114,auVar102);
      auVar49._4_4_ = fVar135 * auVar102._4_4_;
      auVar49._0_4_ = fVar85 * auVar102._0_4_;
      auVar49._8_4_ = fVar137 * auVar102._8_4_;
      auVar49._12_4_ = fVar139 * auVar102._12_4_;
      auVar49._16_4_ = auVar102._16_4_ * 0.0;
      auVar49._20_4_ = auVar102._20_4_ * 0.0;
      auVar49._24_4_ = auVar102._24_4_ * 0.0;
      auVar49._28_4_ = auVar100._28_4_;
      auVar89 = vfmsub231ps_fma(auVar49,auVar109,auVar96);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar92,ZEXT1632(auVar88));
      auVar163._0_4_ = auVar96._0_4_ * auVar114._0_4_;
      auVar163._4_4_ = auVar96._4_4_ * auVar114._4_4_;
      auVar163._8_4_ = auVar96._8_4_ * auVar114._8_4_;
      auVar163._12_4_ = auVar96._12_4_ * auVar114._12_4_;
      auVar163._16_4_ = auVar96._16_4_ * fVar149;
      auVar163._20_4_ = auVar96._20_4_ * fVar150;
      auVar163._24_4_ = auVar96._24_4_ * fVar170;
      auVar163._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar163,auVar108,auVar97);
      auVar103 = vfmadd231ps_avx512vl(auVar100,auVar92,ZEXT1632(auVar88));
      auVar100 = vmulps_avx512vl(auVar101,auVar115);
      auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar117);
      auVar50._4_4_ = auVar99._4_4_ * auVar117._4_4_;
      auVar50._0_4_ = auVar99._0_4_ * auVar117._0_4_;
      auVar50._8_4_ = auVar99._8_4_ * auVar117._8_4_;
      auVar50._12_4_ = auVar99._12_4_ * auVar117._12_4_;
      auVar50._16_4_ = auVar99._16_4_ * auVar117._16_4_;
      auVar50._20_4_ = auVar99._20_4_ * auVar117._20_4_;
      auVar50._24_4_ = auVar99._24_4_ * auVar117._24_4_;
      auVar50._28_4_ = auVar117._28_4_;
      auVar88 = vfmsub231ps_fma(auVar50,auVar116,auVar101);
      auVar164._0_4_ = auVar116._0_4_ * auVar98._0_4_;
      auVar164._4_4_ = auVar116._4_4_ * auVar98._4_4_;
      auVar164._8_4_ = auVar116._8_4_ * auVar98._8_4_;
      auVar164._12_4_ = auVar116._12_4_ * auVar98._12_4_;
      auVar164._16_4_ = fVar171 * auVar98._16_4_;
      auVar164._20_4_ = fVar169 * auVar98._20_4_;
      auVar164._24_4_ = fVar172 * auVar98._24_4_;
      auVar164._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar164,auVar99,auVar115);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar92,auVar100);
      auVar94 = vfmadd231ps_avx512vl(auVar100,auVar92,ZEXT1632(auVar88));
      auVar100 = vmaxps_avx(auVar103,auVar94);
      uVar152 = vcmpps_avx512vl(auVar100,auVar92,2);
      bVar84 = bVar84 & (byte)uVar152;
      auVar186 = ZEXT3264(local_6c0);
      auVar187 = ZEXT3264(local_6e0);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar192 = ZEXT3264(auVar95);
      auVar188 = ZEXT3264(local_700);
      auVar148 = ZEXT3264(local_820);
      if (bVar84 == 0) {
        bVar76 = false;
        auVar189 = ZEXT3264(local_780);
        auVar190 = ZEXT3264(local_7a0);
        auVar191 = ZEXT3264(local_7c0);
      }
      else {
        auVar51._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar51._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar51._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar51._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar51._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar51._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar51._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar51._28_4_ = auVar100._28_4_;
        auVar87 = vfmsub231ps_fma(auVar51,auVar99,auVar97);
        auVar52._4_4_ = auVar97._4_4_ * auVar98._4_4_;
        auVar52._0_4_ = auVar97._0_4_ * auVar98._0_4_;
        auVar52._8_4_ = auVar97._8_4_ * auVar98._8_4_;
        auVar52._12_4_ = auVar97._12_4_ * auVar98._12_4_;
        auVar52._16_4_ = auVar97._16_4_ * auVar98._16_4_;
        auVar52._20_4_ = auVar97._20_4_ * auVar98._20_4_;
        auVar52._24_4_ = auVar97._24_4_ * auVar98._24_4_;
        auVar52._28_4_ = auVar97._28_4_;
        auVar89 = vfmsub231ps_fma(auVar52,auVar102,auVar101);
        auVar53._4_4_ = auVar99._4_4_ * auVar102._4_4_;
        auVar53._0_4_ = auVar99._0_4_ * auVar102._0_4_;
        auVar53._8_4_ = auVar99._8_4_ * auVar102._8_4_;
        auVar53._12_4_ = auVar99._12_4_ * auVar102._12_4_;
        auVar53._16_4_ = auVar99._16_4_ * auVar102._16_4_;
        auVar53._20_4_ = auVar99._20_4_ * auVar102._20_4_;
        auVar53._24_4_ = auVar99._24_4_ * auVar102._24_4_;
        auVar53._28_4_ = auVar99._28_4_;
        auVar86 = vfmsub231ps_fma(auVar53,auVar98,auVar96);
        auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar86));
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87),auVar92);
        auVar96 = vrcp14ps_avx512vl(auVar100);
        auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar100,auVar95);
        auVar88 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
        auVar54._4_4_ = auVar86._4_4_ * auVar114._4_4_;
        auVar54._0_4_ = auVar86._0_4_ * auVar114._0_4_;
        auVar54._8_4_ = auVar86._8_4_ * auVar114._8_4_;
        auVar54._12_4_ = auVar86._12_4_ * auVar114._12_4_;
        auVar54._16_4_ = fVar149 * 0.0;
        auVar54._20_4_ = fVar150 * 0.0;
        auVar54._24_4_ = fVar170 * 0.0;
        auVar54._28_4_ = iVar2;
        auVar89 = vfmadd231ps_fma(auVar54,auVar108,ZEXT1632(auVar89));
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,ZEXT1632(auVar87));
        fVar149 = auVar88._0_4_;
        fVar150 = auVar88._4_4_;
        fVar170 = auVar88._8_4_;
        fVar172 = auVar88._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar172,
                                       CONCAT48(auVar89._8_4_ * fVar170,
                                                CONCAT44(auVar89._4_4_ * fVar150,
                                                         auVar89._0_4_ * fVar149))));
        auVar173._4_4_ = uVar142;
        auVar173._0_4_ = uVar142;
        auVar173._8_4_ = uVar142;
        auVar173._12_4_ = uVar142;
        auVar173._16_4_ = uVar142;
        auVar173._20_4_ = uVar142;
        auVar173._24_4_ = uVar142;
        auVar173._28_4_ = uVar142;
        uVar152 = vcmpps_avx512vl(auVar173,local_5a0,2);
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar4;
        auVar33._0_4_ = uVar4;
        auVar33._8_4_ = uVar4;
        auVar33._12_4_ = uVar4;
        auVar33._16_4_ = uVar4;
        auVar33._20_4_ = uVar4;
        auVar33._24_4_ = uVar4;
        auVar33._28_4_ = uVar4;
        uVar30 = vcmpps_avx512vl(local_5a0,auVar33,2);
        bVar84 = (byte)uVar152 & (byte)uVar30 & bVar84;
        auVar189 = ZEXT3264(local_780);
        auVar190 = ZEXT3264(local_7a0);
        auVar191 = ZEXT3264(local_7c0);
        if (bVar84 != 0) {
          uVar152 = vcmpps_avx512vl(auVar100,auVar92,4);
          bVar84 = bVar84 & (byte)uVar152;
          if (bVar84 != 0) {
            fVar169 = auVar103._0_4_ * fVar149;
            fVar171 = auVar103._4_4_ * fVar150;
            auVar55._4_4_ = fVar171;
            auVar55._0_4_ = fVar169;
            fVar156 = auVar103._8_4_ * fVar170;
            auVar55._8_4_ = fVar156;
            fVar85 = auVar103._12_4_ * fVar172;
            auVar55._12_4_ = fVar85;
            fVar134 = auVar103._16_4_ * 0.0;
            auVar55._16_4_ = fVar134;
            fVar135 = auVar103._20_4_ * 0.0;
            auVar55._20_4_ = fVar135;
            fVar136 = auVar103._24_4_ * 0.0;
            auVar55._24_4_ = fVar136;
            auVar55._28_4_ = auVar100._28_4_;
            auVar96 = vsubps_avx512vl(auVar95,auVar55);
            local_5e0._0_4_ =
                 (float)((uint)(bVar77 & 1) * (int)fVar169 |
                        (uint)!(bool)(bVar77 & 1) * auVar96._0_4_);
            bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar76 * (int)fVar171 | (uint)!bVar76 * auVar96._4_4_);
            bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar76 * (int)fVar156 | (uint)!bVar76 * auVar96._8_4_);
            bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar76 * (int)fVar85 | (uint)!bVar76 * auVar96._12_4_);
            bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
            local_5e0._16_4_ = (float)((uint)bVar76 * (int)fVar134 | (uint)!bVar76 * auVar96._16_4_)
            ;
            bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
            local_5e0._20_4_ = (float)((uint)bVar76 * (int)fVar135 | (uint)!bVar76 * auVar96._20_4_)
            ;
            bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
            local_5e0._24_4_ = (float)((uint)bVar76 * (int)fVar136 | (uint)!bVar76 * auVar96._24_4_)
            ;
            bVar76 = SUB81(uVar79 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar76 * auVar100._28_4_ | (uint)!bVar76 * auVar96._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar10),auVar105);
            auVar88 = vfmadd213ps_fma(auVar100,local_5e0,auVar105);
            uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar34._4_4_ = uVar4;
            auVar34._0_4_ = uVar4;
            auVar34._8_4_ = uVar4;
            auVar34._12_4_ = uVar4;
            auVar34._16_4_ = uVar4;
            auVar34._20_4_ = uVar4;
            auVar34._24_4_ = uVar4;
            auVar34._28_4_ = uVar4;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                          CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                   CONCAT44(auVar88._4_4_ +
                                                                            auVar88._4_4_,
                                                                            auVar88._0_4_ +
                                                                            auVar88._0_4_)))),
                                       auVar34);
            uVar152 = vcmpps_avx512vl(local_5a0,auVar100,6);
            if (((byte)uVar152 & bVar84) != 0) {
              auVar161._0_4_ = auVar94._0_4_ * fVar149;
              auVar161._4_4_ = auVar94._4_4_ * fVar150;
              auVar161._8_4_ = auVar94._8_4_ * fVar170;
              auVar161._12_4_ = auVar94._12_4_ * fVar172;
              auVar161._16_4_ = auVar94._16_4_ * 0.0;
              auVar161._20_4_ = auVar94._20_4_ * 0.0;
              auVar161._24_4_ = auVar94._24_4_ * 0.0;
              auVar161._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar95,auVar161);
              auVar120._0_4_ =
                   (uint)(bVar77 & 1) * (int)auVar161._0_4_ |
                   (uint)!(bool)(bVar77 & 1) * auVar100._0_4_;
              bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar76 * (int)auVar161._4_4_ | (uint)!bVar76 * auVar100._4_4_;
              bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar76 * (int)auVar161._8_4_ | (uint)!bVar76 * auVar100._8_4_;
              bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
              auVar120._12_4_ =
                   (uint)bVar76 * (int)auVar161._12_4_ | (uint)!bVar76 * auVar100._12_4_;
              bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
              auVar120._16_4_ =
                   (uint)bVar76 * (int)auVar161._16_4_ | (uint)!bVar76 * auVar100._16_4_;
              bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
              auVar120._20_4_ =
                   (uint)bVar76 * (int)auVar161._20_4_ | (uint)!bVar76 * auVar100._20_4_;
              bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
              auVar120._24_4_ =
                   (uint)bVar76 * (int)auVar161._24_4_ | (uint)!bVar76 * auVar100._24_4_;
              auVar120._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar100._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar120,auVar95,auVar35);
              local_580 = 0;
              local_560 = local_7d0._0_8_;
              uStack_558 = local_7d0._8_8_;
              local_550 = local_7e0._0_8_;
              uStack_548 = local_7e0._8_8_;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar76 = true, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_019bd646;
                fVar141 = 1.0 / fVar141;
                local_520[0] = fVar141 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar141 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar141 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar141 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar141 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar141 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar141 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                local_720 = (float)(uint)((byte)uVar152 & bVar84);
                lVar82 = 0;
                for (uVar79 = (ulong)(uint)local_720; (uVar79 & 1) == 0;
                    uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                  lVar82 = lVar82 + 1;
                }
                local_6a0._0_8_ = lVar82;
                auVar132 = vpbroadcastd_avx512f();
                _local_480 = vmovdqa64_avx512f(auVar132);
                uVar79 = (ulong)(uint)local_720;
                local_57c = iVar31;
                local_570 = auVar29;
                while (auVar88 = auVar185._0_16_, uVar79 != 0) {
                  local_720 = (float)uVar79;
                  fStack_71c = (float)(uVar79 >> 0x20);
                  local_660 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[local_6a0._0_8_]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)(local_500 + local_6a0._0_8_ * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) =
                       *(undefined4 *)(local_4e0 + local_6a0._0_8_ * 4);
                  local_850.context = context->user;
                  fVar170 = local_200._0_4_;
                  fVar149 = 1.0 - fVar170;
                  fVar141 = fVar149 * fVar149 * -3.0;
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                            ZEXT416((uint)(fVar170 * fVar149)),ZEXT416(0xc0000000));
                  auVar87 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar149)),
                                            ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000));
                  fVar149 = auVar89._0_4_ * 3.0;
                  fVar150 = auVar87._0_4_ * 3.0;
                  fVar170 = fVar170 * fVar170 * 3.0;
                  auVar167._0_4_ = fVar170 * (float)local_670._0_4_;
                  auVar167._4_4_ = fVar170 * (float)local_670._4_4_;
                  auVar167._8_4_ = fVar170 * fStack_668;
                  auVar167._12_4_ = fVar170 * fStack_664;
                  auVar143._4_4_ = fVar150;
                  auVar143._0_4_ = fVar150;
                  auVar143._8_4_ = fVar150;
                  auVar143._12_4_ = fVar150;
                  auVar89 = vfmadd132ps_fma(auVar143,auVar167,local_7e0);
                  auVar159._4_4_ = fVar149;
                  auVar159._0_4_ = fVar149;
                  auVar159._8_4_ = fVar149;
                  auVar159._12_4_ = fVar149;
                  auVar89 = vfmadd132ps_fma(auVar159,auVar89,local_7d0);
                  auVar144._4_4_ = fVar141;
                  auVar144._0_4_ = fVar141;
                  auVar144._8_4_ = fVar141;
                  auVar144._12_4_ = fVar141;
                  auVar89 = vfmadd213ps_fma(auVar144,auVar29,auVar89);
                  auVar132 = vbroadcastss_avx512f(auVar89);
                  auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar133,ZEXT1664(auVar89));
                  auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar133,ZEXT1664(auVar89));
                  local_2c0[0] = (RTCHitN)auVar132[0];
                  local_2c0[1] = (RTCHitN)auVar132[1];
                  local_2c0[2] = (RTCHitN)auVar132[2];
                  local_2c0[3] = (RTCHitN)auVar132[3];
                  local_2c0[4] = (RTCHitN)auVar132[4];
                  local_2c0[5] = (RTCHitN)auVar132[5];
                  local_2c0[6] = (RTCHitN)auVar132[6];
                  local_2c0[7] = (RTCHitN)auVar132[7];
                  local_2c0[8] = (RTCHitN)auVar132[8];
                  local_2c0[9] = (RTCHitN)auVar132[9];
                  local_2c0[10] = (RTCHitN)auVar132[10];
                  local_2c0[0xb] = (RTCHitN)auVar132[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar132[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar132[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar132[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar132[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar132[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar132[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar132[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar132[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar132[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar132[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar132[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar132[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar132[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar132[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar132[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar132[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar132[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar132[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar132[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar132[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar132[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar132[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar132[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar132[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar132[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar132[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar132[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar132[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar132[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar132[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar132[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar132[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar132[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar132[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar132[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar132[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar132[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar132[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar132[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar132[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar132[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar132[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar132[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar132[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar132[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar132[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar132[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar132[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar132[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar132[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar132[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar132[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar132 = vmovdqa64_avx512f(_local_480);
                  local_140 = vmovdqa64_avx512f(auVar132);
                  vpcmpeqd_avx2(auVar132._0_32_,auVar132._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                  auVar132 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar132);
                  local_850.valid = (int *)local_640;
                  local_850.geometryUserPtr = pGVar12->userPtr;
                  local_850.hit = local_2c0;
                  local_850.N = 0x10;
                  local_850.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_850);
                    auVar191 = ZEXT3264(local_7c0);
                    auVar190 = ZEXT3264(local_7a0);
                    auVar189 = ZEXT3264(local_780);
                    auVar148 = ZEXT3264(local_820);
                    auVar184 = ZEXT3264(local_800);
                    auVar188 = ZEXT3264(local_700);
                    auVar187 = ZEXT3264(local_6e0);
                    auVar186 = ZEXT3264(local_6c0);
                    auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    auVar185 = ZEXT1664(auVar88);
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar192 = ZEXT3264(auVar100);
                    auVar132 = vmovdqa64_avx512f(local_640);
                  }
                  auVar88 = auVar185._0_16_;
                  uVar152 = vptestmd_avx512f(auVar132,auVar132);
                  if ((short)uVar152 != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_850);
                      auVar191 = ZEXT3264(local_7c0);
                      auVar190 = ZEXT3264(local_7a0);
                      auVar189 = ZEXT3264(local_780);
                      auVar148 = ZEXT3264(local_820);
                      auVar184 = ZEXT3264(local_800);
                      auVar188 = ZEXT3264(local_700);
                      auVar187 = ZEXT3264(local_6e0);
                      auVar186 = ZEXT3264(local_6c0);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                      auVar185 = ZEXT1664(auVar88);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar192 = ZEXT3264(auVar100);
                      auVar132 = vmovdqa64_avx512f(local_640);
                    }
                    uVar79 = vptestmd_avx512f(auVar132,auVar132);
                    auVar132 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar76 = (bool)((byte)uVar79 & 1);
                    bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar79 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar79 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar79 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar79 >> 8) & 1);
                    bVar22 = (bool)((byte)(uVar79 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar79 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar79 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar79 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar79 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar79 >> 0xe) & 1);
                    bVar28 = SUB81(uVar79 >> 0xf,0);
                    *(uint *)(local_850.ray + 0x200) =
                         (uint)bVar76 * auVar132._0_4_ |
                         (uint)!bVar76 * *(int *)(local_850.ray + 0x200);
                    *(uint *)(local_850.ray + 0x204) =
                         (uint)bVar14 * auVar132._4_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x204);
                    *(uint *)(local_850.ray + 0x208) =
                         (uint)bVar15 * auVar132._8_4_ |
                         (uint)!bVar15 * *(int *)(local_850.ray + 0x208);
                    *(uint *)(local_850.ray + 0x20c) =
                         (uint)bVar16 * auVar132._12_4_ |
                         (uint)!bVar16 * *(int *)(local_850.ray + 0x20c);
                    *(uint *)(local_850.ray + 0x210) =
                         (uint)bVar17 * auVar132._16_4_ |
                         (uint)!bVar17 * *(int *)(local_850.ray + 0x210);
                    *(uint *)(local_850.ray + 0x214) =
                         (uint)bVar18 * auVar132._20_4_ |
                         (uint)!bVar18 * *(int *)(local_850.ray + 0x214);
                    *(uint *)(local_850.ray + 0x218) =
                         (uint)bVar19 * auVar132._24_4_ |
                         (uint)!bVar19 * *(int *)(local_850.ray + 0x218);
                    *(uint *)(local_850.ray + 0x21c) =
                         (uint)bVar20 * auVar132._28_4_ |
                         (uint)!bVar20 * *(int *)(local_850.ray + 0x21c);
                    *(uint *)(local_850.ray + 0x220) =
                         (uint)bVar21 * auVar132._32_4_ |
                         (uint)!bVar21 * *(int *)(local_850.ray + 0x220);
                    *(uint *)(local_850.ray + 0x224) =
                         (uint)bVar22 * auVar132._36_4_ |
                         (uint)!bVar22 * *(int *)(local_850.ray + 0x224);
                    *(uint *)(local_850.ray + 0x228) =
                         (uint)bVar23 * auVar132._40_4_ |
                         (uint)!bVar23 * *(int *)(local_850.ray + 0x228);
                    *(uint *)(local_850.ray + 0x22c) =
                         (uint)bVar24 * auVar132._44_4_ |
                         (uint)!bVar24 * *(int *)(local_850.ray + 0x22c);
                    *(uint *)(local_850.ray + 0x230) =
                         (uint)bVar25 * auVar132._48_4_ |
                         (uint)!bVar25 * *(int *)(local_850.ray + 0x230);
                    *(uint *)(local_850.ray + 0x234) =
                         (uint)bVar26 * auVar132._52_4_ |
                         (uint)!bVar26 * *(int *)(local_850.ray + 0x234);
                    *(uint *)(local_850.ray + 0x238) =
                         (uint)bVar27 * auVar132._56_4_ |
                         (uint)!bVar27 * *(int *)(local_850.ray + 0x238);
                    *(uint *)(local_850.ray + 0x23c) =
                         (uint)bVar28 * auVar132._60_4_ |
                         (uint)!bVar28 * *(int *)(local_850.ray + 0x23c);
                    if ((short)uVar79 != 0) {
                      bVar76 = true;
                      goto LAB_019bd646;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = local_660;
                  lVar82 = 0;
                  uVar79 = CONCAT44(fStack_71c,local_720) ^ 1L << (local_6a0._0_8_ & 0x3f);
                  for (uVar32 = uVar79; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000
                      ) {
                    lVar82 = lVar82 + 1;
                  }
                  local_6a0._0_8_ = lVar82;
                }
              }
            }
          }
        }
        bVar76 = false;
      }
    }
LAB_019bd646:
    auVar132 = _local_480;
    if (8 < iVar31) {
      local_6a0 = vpbroadcastd_avx512vl();
      local_480._4_4_ = 1.0 / (float)local_4c0._0_4_;
      local_480._0_4_ = local_480._4_4_;
      fStack_478 = (float)local_480._4_4_;
      fStack_474 = (float)local_480._4_4_;
      fStack_470 = (float)local_480._4_4_;
      fStack_46c = (float)local_480._4_4_;
      fStack_468 = (float)local_480._4_4_;
      uStack_464 = local_480._4_4_;
      auStack_460 = auVar132._32_32_;
      auVar132 = vpbroadcastd_avx512f();
      local_4c0 = vmovdqa64_avx512f(auVar132);
      local_720 = fVar151;
      fStack_71c = fVar151;
      fStack_718 = fVar151;
      fStack_714 = fVar151;
      fStack_710 = fVar151;
      fStack_70c = fVar151;
      fStack_708 = fVar151;
      fStack_704 = fVar151;
      local_660 = uVar142;
      uStack_65c = uVar142;
      uStack_658 = uVar142;
      uStack_654 = uVar142;
      uStack_650 = uVar142;
      uStack_64c = uVar142;
      uStack_648 = uVar142;
      uStack_644 = uVar142;
      for (lVar82 = 8; lVar82 < local_730; lVar82 = lVar82 + 8) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar100,_DAT_01fb4ba0);
        uVar30 = vpcmpd_avx512vl(auVar99,local_6a0,1);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 * 4 + lVar83);
        auVar96 = *(undefined1 (*) [32])(lVar83 + 0x21fb768 + lVar82 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar83 + 0x21fbbec + lVar82 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar83 + 0x21fc070 + lVar82 * 4);
        local_7a0 = auVar190._0_32_;
        auVar101 = vmulps_avx512vl(local_7a0,auVar98);
        local_7c0 = auVar191._0_32_;
        auVar109 = vmulps_avx512vl(local_7c0,auVar98);
        auVar56._4_4_ = auVar98._4_4_ * (float)local_3e0._4_4_;
        auVar56._0_4_ = auVar98._0_4_ * (float)local_3e0._0_4_;
        auVar56._8_4_ = auVar98._8_4_ * fStack_3d8;
        auVar56._12_4_ = auVar98._12_4_ * fStack_3d4;
        auVar56._16_4_ = auVar98._16_4_ * fStack_3d0;
        auVar56._20_4_ = auVar98._20_4_ * fStack_3cc;
        auVar56._24_4_ = auVar98._24_4_ * fStack_3c8;
        auVar56._28_4_ = auVar99._28_4_;
        auVar94 = auVar148._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar94);
        local_780 = auVar189._0_32_;
        auVar101 = vfmadd231ps_avx512vl(auVar109,auVar97,local_780);
        auVar109 = vfmadd231ps_avx512vl(auVar56,auVar97,local_3c0);
        auVar180 = auVar188._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar180);
        auVar95 = auVar184._0_32_;
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar95);
        auVar88 = vfmadd231ps_fma(auVar109,auVar96,local_3a0);
        local_6c0 = auVar186._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar99,auVar100,local_6c0);
        auVar179 = auVar187._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar179);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 * 4 + lVar83);
        auVar101 = *(undefined1 (*) [32])(lVar83 + 0x21fdb88 + lVar82 * 4);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar100,local_380);
        auVar109 = *(undefined1 (*) [32])(lVar83 + 0x21fe00c + lVar82 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar83 + 0x21fe490 + lVar82 * 4);
        auVar102 = vmulps_avx512vl(local_7a0,auVar108);
        auVar103 = vmulps_avx512vl(local_7c0,auVar108);
        auVar57._4_4_ = auVar108._4_4_ * (float)local_3e0._4_4_;
        auVar57._0_4_ = auVar108._0_4_ * (float)local_3e0._0_4_;
        auVar57._8_4_ = auVar108._8_4_ * fStack_3d8;
        auVar57._12_4_ = auVar108._12_4_ * fStack_3d4;
        auVar57._16_4_ = auVar108._16_4_ * fStack_3d0;
        auVar57._20_4_ = auVar108._20_4_ * fStack_3cc;
        auVar57._24_4_ = auVar108._24_4_ * fStack_3c8;
        auVar57._28_4_ = uStack_3c4;
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar94);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_780);
        auVar104 = vfmadd231ps_avx512vl(auVar57,auVar109,local_3c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar180);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar95);
        auVar89 = vfmadd231ps_fma(auVar104,auVar101,local_3a0);
        auVar104 = vfmadd231ps_avx512vl(auVar102,auVar99,local_6c0);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar179);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar99,local_380);
        auVar106 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar89));
        auVar102 = vsubps_avx(auVar104,auVar92);
        auVar103 = vsubps_avx(auVar105,auVar93);
        auVar107 = vmulps_avx512vl(auVar93,auVar102);
        auVar121 = vmulps_avx512vl(auVar92,auVar103);
        auVar107 = vsubps_avx512vl(auVar107,auVar121);
        auVar121 = vmulps_avx512vl(auVar103,auVar103);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar102,auVar102);
        auVar106 = vmulps_avx512vl(auVar106,auVar106);
        auVar106 = vmulps_avx512vl(auVar106,auVar121);
        auVar107 = vmulps_avx512vl(auVar107,auVar107);
        uVar152 = vcmpps_avx512vl(auVar107,auVar106,2);
        bVar84 = (byte)uVar30 & (byte)uVar152;
        if (bVar84 == 0) {
LAB_019be0e9:
          auVar184 = ZEXT3264(auVar95);
          auVar148 = ZEXT3264(auVar94);
        }
        else {
          auVar108 = vmulps_avx512vl(local_760,auVar108);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_420,auVar109);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_400,auVar101);
          auVar98 = vmulps_avx512vl(local_760,auVar98);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_440,auVar98);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_420,auVar97);
          auVar101 = vfmadd213ps_avx512vl(auVar100,local_400,auVar96);
          auVar100 = *(undefined1 (*) [32])(lVar83 + 0x21fc4f4 + lVar82 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar83 + 0x21fc978 + lVar82 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar83 + 0x21fcdfc + lVar82 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar83 + 0x21fd280 + lVar82 * 4);
          auVar109 = vmulps_avx512vl(local_7a0,auVar98);
          auVar108 = vmulps_avx512vl(local_7c0,auVar98);
          auVar98 = vmulps_avx512vl(local_760,auVar98);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar97,auVar94);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_780);
          auVar97 = vfmadd231ps_avx512vl(auVar98,local_440,auVar97);
          auVar98 = vfmadd231ps_avx512vl(auVar109,auVar96,auVar180);
          auVar109 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_420,auVar96);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,local_6c0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,auVar179);
          auVar108 = vfmadd231ps_avx512vl(auVar96,local_400,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar83 + 0x21fe914 + lVar82 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar83 + 0x21ff21c + lVar82 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar83 + 0x21ff6a0 + lVar82 * 4);
          auVar106 = vmulps_avx512vl(local_7a0,auVar97);
          auVar107 = vmulps_avx512vl(local_7c0,auVar97);
          auVar97 = vmulps_avx512vl(local_760,auVar97);
          auVar94 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar94);
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar96,local_780);
          auVar97 = vfmadd231ps_avx512vl(auVar97,local_440,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar83 + 0x21fed98 + lVar82 * 4);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar180);
          auVar95 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_420,auVar96);
          auVar97 = vfmadd231ps_avx512vl(auVar94,auVar100,local_6c0);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar179);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_400,auVar100);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar95);
          vandps_avx512vl(auVar109,auVar95);
          auVar100 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(auVar108,auVar95);
          auVar100 = vmaxps_avx(auVar100,auVar95);
          auVar74._4_4_ = fStack_71c;
          auVar74._0_4_ = local_720;
          auVar74._8_4_ = fStack_718;
          auVar74._12_4_ = fStack_714;
          auVar74._16_4_ = fStack_710;
          auVar74._20_4_ = fStack_70c;
          auVar74._24_4_ = fStack_708;
          auVar74._28_4_ = fStack_704;
          uVar79 = vcmpps_avx512vl(auVar100,auVar74,1);
          bVar14 = (bool)((byte)uVar79 & 1);
          auVar122._0_4_ = (float)((uint)bVar14 * auVar102._0_4_ | (uint)!bVar14 * auVar98._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar98._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar98._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar98._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar14 * auVar102._16_4_ | (uint)!bVar14 * auVar98._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar14 * auVar102._20_4_ | (uint)!bVar14 * auVar98._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar14 * auVar102._24_4_ | (uint)!bVar14 * auVar98._24_4_)
          ;
          bVar14 = SUB81(uVar79 >> 7,0);
          auVar122._28_4_ = (uint)bVar14 * auVar102._28_4_ | (uint)!bVar14 * auVar98._28_4_;
          bVar14 = (bool)((byte)uVar79 & 1);
          auVar123._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar109._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar109._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar109._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar109._12_4_);
          bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar14 * auVar103._16_4_ | (uint)!bVar14 * auVar109._16_4_);
          bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar14 * auVar103._20_4_ | (uint)!bVar14 * auVar109._20_4_);
          bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar14 * auVar103._24_4_ | (uint)!bVar14 * auVar109._24_4_);
          bVar14 = SUB81(uVar79 >> 7,0);
          auVar123._28_4_ = (uint)bVar14 * auVar103._28_4_ | (uint)!bVar14 * auVar109._28_4_;
          vandps_avx512vl(auVar97,auVar95);
          vandps_avx512vl(auVar94,auVar95);
          auVar100 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar96,auVar95);
          auVar100 = vmaxps_avx(auVar100,auVar123);
          uVar79 = vcmpps_avx512vl(auVar100,auVar74,1);
          bVar14 = (bool)((byte)uVar79 & 1);
          auVar124._0_4_ = (uint)bVar14 * auVar102._0_4_ | (uint)!bVar14 * auVar97._0_4_;
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar97._4_4_;
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar97._8_4_;
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar97._12_4_;
          bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar14 * auVar102._16_4_ | (uint)!bVar14 * auVar97._16_4_;
          bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar14 * auVar102._20_4_ | (uint)!bVar14 * auVar97._20_4_;
          bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar14 * auVar102._24_4_ | (uint)!bVar14 * auVar97._24_4_;
          bVar14 = SUB81(uVar79 >> 7,0);
          auVar124._28_4_ = (uint)bVar14 * auVar102._28_4_ | (uint)!bVar14 * auVar97._28_4_;
          bVar14 = (bool)((byte)uVar79 & 1);
          auVar125._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar94._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar94._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar94._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar94._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar14 * auVar103._16_4_ | (uint)!bVar14 * auVar94._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar14 * auVar103._20_4_ | (uint)!bVar14 * auVar94._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar14 * auVar103._24_4_ | (uint)!bVar14 * auVar94._24_4_)
          ;
          bVar14 = SUB81(uVar79 >> 7,0);
          auVar125._28_4_ = (uint)bVar14 * auVar103._28_4_ | (uint)!bVar14 * auVar94._28_4_;
          auVar175._8_4_ = 0x80000000;
          auVar175._0_8_ = 0x8000000080000000;
          auVar175._12_4_ = 0x80000000;
          auVar175._16_4_ = 0x80000000;
          auVar175._20_4_ = 0x80000000;
          auVar175._24_4_ = 0x80000000;
          auVar175._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar124,auVar175);
          auVar106 = auVar185._0_32_;
          auVar96 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar106);
          auVar87 = vfmadd231ps_fma(auVar96,auVar123,auVar123);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
          auVar183._8_4_ = 0xbf000000;
          auVar183._0_8_ = 0xbf000000bf000000;
          auVar183._12_4_ = 0xbf000000;
          auVar183._16_4_ = 0xbf000000;
          auVar183._20_4_ = 0xbf000000;
          auVar183._24_4_ = 0xbf000000;
          auVar183._28_4_ = 0xbf000000;
          fVar151 = auVar96._0_4_;
          fVar141 = auVar96._4_4_;
          fVar149 = auVar96._8_4_;
          fVar150 = auVar96._12_4_;
          fVar170 = auVar96._16_4_;
          fVar172 = auVar96._20_4_;
          fVar169 = auVar96._24_4_;
          auVar58._4_4_ = fVar141 * fVar141 * fVar141 * auVar87._4_4_ * -0.5;
          auVar58._0_4_ = fVar151 * fVar151 * fVar151 * auVar87._0_4_ * -0.5;
          auVar58._8_4_ = fVar149 * fVar149 * fVar149 * auVar87._8_4_ * -0.5;
          auVar58._12_4_ = fVar150 * fVar150 * fVar150 * auVar87._12_4_ * -0.5;
          auVar58._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar58._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar58._24_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar58._28_4_ = auVar123._28_4_;
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar58,auVar97,auVar96);
          auVar59._4_4_ = auVar123._4_4_ * auVar96._4_4_;
          auVar59._0_4_ = auVar123._0_4_ * auVar96._0_4_;
          auVar59._8_4_ = auVar123._8_4_ * auVar96._8_4_;
          auVar59._12_4_ = auVar123._12_4_ * auVar96._12_4_;
          auVar59._16_4_ = auVar123._16_4_ * auVar96._16_4_;
          auVar59._20_4_ = auVar123._20_4_ * auVar96._20_4_;
          auVar59._24_4_ = auVar123._24_4_ * auVar96._24_4_;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = auVar96._4_4_ * -auVar122._4_4_;
          auVar60._0_4_ = auVar96._0_4_ * -auVar122._0_4_;
          auVar60._8_4_ = auVar96._8_4_ * -auVar122._8_4_;
          auVar60._12_4_ = auVar96._12_4_ * -auVar122._12_4_;
          auVar60._16_4_ = auVar96._16_4_ * -auVar122._16_4_;
          auVar60._20_4_ = auVar96._20_4_ * -auVar122._20_4_;
          auVar60._24_4_ = auVar96._24_4_ * -auVar122._24_4_;
          auVar60._28_4_ = auVar123._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,auVar106);
          auVar96 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar125,auVar125);
          auVar109 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar183);
          fVar151 = auVar109._0_4_;
          fVar141 = auVar109._4_4_;
          fVar149 = auVar109._8_4_;
          fVar150 = auVar109._12_4_;
          fVar170 = auVar109._16_4_;
          fVar172 = auVar109._20_4_;
          fVar169 = auVar109._24_4_;
          auVar61._4_4_ = fVar141 * fVar141 * fVar141 * auVar96._4_4_;
          auVar61._0_4_ = fVar151 * fVar151 * fVar151 * auVar96._0_4_;
          auVar61._8_4_ = fVar149 * fVar149 * fVar149 * auVar96._8_4_;
          auVar61._12_4_ = fVar150 * fVar150 * fVar150 * auVar96._12_4_;
          auVar61._16_4_ = fVar170 * fVar170 * fVar170 * auVar96._16_4_;
          auVar61._20_4_ = fVar172 * fVar172 * fVar172 * auVar96._20_4_;
          auVar61._24_4_ = fVar169 * fVar169 * fVar169 * auVar96._24_4_;
          auVar61._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar61,auVar97,auVar109);
          auVar62._4_4_ = auVar125._4_4_ * auVar96._4_4_;
          auVar62._0_4_ = auVar125._0_4_ * auVar96._0_4_;
          auVar62._8_4_ = auVar125._8_4_ * auVar96._8_4_;
          auVar62._12_4_ = auVar125._12_4_ * auVar96._12_4_;
          auVar62._16_4_ = auVar125._16_4_ * auVar96._16_4_;
          auVar62._20_4_ = auVar125._20_4_ * auVar96._20_4_;
          auVar62._24_4_ = auVar125._24_4_ * auVar96._24_4_;
          auVar62._28_4_ = auVar109._28_4_;
          auVar63._4_4_ = auVar96._4_4_ * auVar100._4_4_;
          auVar63._0_4_ = auVar96._0_4_ * auVar100._0_4_;
          auVar63._8_4_ = auVar96._8_4_ * auVar100._8_4_;
          auVar63._12_4_ = auVar96._12_4_ * auVar100._12_4_;
          auVar63._16_4_ = auVar96._16_4_ * auVar100._16_4_;
          auVar63._20_4_ = auVar96._20_4_ * auVar100._20_4_;
          auVar63._24_4_ = auVar96._24_4_ * auVar100._24_4_;
          auVar63._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar96,auVar106);
          auVar87 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar88),auVar92);
          auVar96 = ZEXT1632(auVar88);
          auVar86 = vfmadd213ps_fma(auVar60,auVar96,auVar93);
          auVar97 = vfmadd213ps_avx512vl(auVar98,auVar96,auVar101);
          auVar109 = vfmadd213ps_avx512vl(auVar62,ZEXT1632(auVar89),auVar104);
          auVar90 = vfnmadd213ps_fma(auVar59,auVar96,auVar92);
          auVar108 = ZEXT1632(auVar89);
          auVar7 = vfmadd213ps_fma(auVar63,auVar108,auVar105);
          auVar154 = vfnmadd213ps_fma(auVar60,auVar96,auVar93);
          auVar8 = vfmadd213ps_fma(auVar100,auVar108,auVar99);
          auVar93 = ZEXT1632(auVar88);
          auVar91 = vfnmadd231ps_fma(auVar101,auVar93,auVar98);
          auVar157 = vfnmadd213ps_fma(auVar62,auVar108,auVar104);
          auVar158 = vfnmadd213ps_fma(auVar63,auVar108,auVar105);
          auVar174 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar89),auVar100);
          auVar99 = vsubps_avx512vl(auVar109,ZEXT1632(auVar90));
          auVar100 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar154));
          auVar96 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar91));
          auVar64._4_4_ = auVar100._4_4_ * auVar91._4_4_;
          auVar64._0_4_ = auVar100._0_4_ * auVar91._0_4_;
          auVar64._8_4_ = auVar100._8_4_ * auVar91._8_4_;
          auVar64._12_4_ = auVar100._12_4_ * auVar91._12_4_;
          auVar64._16_4_ = auVar100._16_4_ * 0.0;
          auVar64._20_4_ = auVar100._20_4_ * 0.0;
          auVar64._24_4_ = auVar100._24_4_ * 0.0;
          auVar64._28_4_ = auVar98._28_4_;
          auVar88 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar154),auVar96);
          auVar65._4_4_ = auVar96._4_4_ * auVar90._4_4_;
          auVar65._0_4_ = auVar96._0_4_ * auVar90._0_4_;
          auVar65._8_4_ = auVar96._8_4_ * auVar90._8_4_;
          auVar65._12_4_ = auVar96._12_4_ * auVar90._12_4_;
          auVar65._16_4_ = auVar96._16_4_ * 0.0;
          auVar65._20_4_ = auVar96._20_4_ * 0.0;
          auVar65._24_4_ = auVar96._24_4_ * 0.0;
          auVar65._28_4_ = auVar96._28_4_;
          auVar9 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar91),auVar99);
          auVar66._4_4_ = auVar154._4_4_ * auVar99._4_4_;
          auVar66._0_4_ = auVar154._0_4_ * auVar99._0_4_;
          auVar66._8_4_ = auVar154._8_4_ * auVar99._8_4_;
          auVar66._12_4_ = auVar154._12_4_ * auVar99._12_4_;
          auVar66._16_4_ = auVar99._16_4_ * 0.0;
          auVar66._20_4_ = auVar99._20_4_ * 0.0;
          auVar66._24_4_ = auVar99._24_4_ * 0.0;
          auVar66._28_4_ = auVar99._28_4_;
          auVar10 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar90),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar106,ZEXT1632(auVar9));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar88));
          uVar79 = vcmpps_avx512vl(auVar100,auVar106,2);
          bVar77 = (byte)uVar79;
          fVar85 = (float)((uint)(bVar77 & 1) * auVar87._0_4_ |
                          (uint)!(bool)(bVar77 & 1) * auVar157._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          fVar135 = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar157._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          fVar137 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar157._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          fVar139 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar157._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar85))));
          fVar134 = (float)((uint)(bVar77 & 1) * auVar86._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar158._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          fVar136 = (float)((uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar158._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          fVar138 = (float)((uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar158._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          fVar140 = (float)((uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar158._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar134))));
          auVar126._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar174._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar174._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar174._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar174._12_4_)
          ;
          fVar151 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar97._16_4_);
          auVar126._16_4_ = fVar151;
          fVar141 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar97._20_4_);
          auVar126._20_4_ = fVar141;
          fVar149 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar97._24_4_);
          auVar126._24_4_ = fVar149;
          iVar2 = (uint)(byte)(uVar79 >> 7) * auVar97._28_4_;
          auVar126._28_4_ = iVar2;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar109);
          auVar127._0_4_ =
               (uint)(bVar77 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar88._0_4_;
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar88._4_4_;
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar88._8_4_;
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar88._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar100._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar100._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar100._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar154),ZEXT1632(auVar7));
          auVar128._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar87._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar87._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar87._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar87._12_4_)
          ;
          fVar150 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar100._16_4_);
          auVar128._16_4_ = fVar150;
          fVar170 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar100._20_4_);
          auVar128._20_4_ = fVar170;
          fVar172 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar100._24_4_);
          auVar128._24_4_ = fVar172;
          auVar128._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar8));
          auVar129._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar86._0_4_);
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar86._4_4_);
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar86._8_4_);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar86._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar100._16_4_);
          auVar129._16_4_ = fVar169;
          fVar171 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar100._20_4_);
          auVar129._20_4_ = fVar171;
          fVar156 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar100._24_4_);
          auVar129._24_4_ = fVar156;
          iVar3 = (uint)(byte)(uVar79 >> 7) * auVar100._28_4_;
          auVar129._28_4_ = iVar3;
          auVar130._0_4_ =
               (uint)(bVar77 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar109._0_4_;
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar14 * (int)auVar90._4_4_ | (uint)!bVar14 * auVar109._4_4_;
          bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar14 * (int)auVar90._8_4_ | (uint)!bVar14 * auVar109._8_4_;
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar14 * (int)auVar90._12_4_ | (uint)!bVar14 * auVar109._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar109._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar109._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar109._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar109._28_4_;
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar109 = vsubps_avx512vl(auVar130,auVar108);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar154._12_4_ |
                                                  (uint)!bVar18 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar154._8_4_ |
                                                           (uint)!bVar16 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar154._4_4_ |
                                                                    (uint)!bVar14 * auVar7._4_4_,
                                                                    (uint)(bVar77 & 1) *
                                                                    (int)auVar154._0_4_ |
                                                                    (uint)!(bool)(bVar77 & 1) *
                                                                    auVar7._0_4_)))),auVar102);
          auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar91._12_4_ |
                                                  (uint)!bVar19 * auVar8._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar91._8_4_ |
                                                           (uint)!bVar17 * auVar8._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar91._4_4_ |
                                                                    (uint)!bVar15 * auVar8._4_4_,
                                                                    (uint)(bVar77 & 1) *
                                                                    (int)auVar91._0_4_ |
                                                                    (uint)!(bool)(bVar77 & 1) *
                                                                    auVar8._0_4_)))),auVar126);
          auVar98 = vsubps_avx(auVar108,auVar127);
          auVar99 = vsubps_avx(auVar102,auVar128);
          auVar101 = vsubps_avx(auVar126,auVar129);
          auVar67._4_4_ = auVar97._4_4_ * fVar135;
          auVar67._0_4_ = auVar97._0_4_ * fVar85;
          auVar67._8_4_ = auVar97._8_4_ * fVar137;
          auVar67._12_4_ = auVar97._12_4_ * fVar139;
          auVar67._16_4_ = auVar97._16_4_ * 0.0;
          auVar67._20_4_ = auVar97._20_4_ * 0.0;
          auVar67._24_4_ = auVar97._24_4_ * 0.0;
          auVar67._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar67,auVar126,auVar109);
          auVar162._0_4_ = fVar134 * auVar109._0_4_;
          auVar162._4_4_ = fVar136 * auVar109._4_4_;
          auVar162._8_4_ = fVar138 * auVar109._8_4_;
          auVar162._12_4_ = fVar140 * auVar109._12_4_;
          auVar162._16_4_ = auVar109._16_4_ * 0.0;
          auVar162._20_4_ = auVar109._20_4_ * 0.0;
          auVar162._24_4_ = auVar109._24_4_ * 0.0;
          auVar162._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar162,auVar108,auVar96);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,ZEXT1632(auVar88));
          auVar165._0_4_ = auVar96._0_4_ * auVar126._0_4_;
          auVar165._4_4_ = auVar96._4_4_ * auVar126._4_4_;
          auVar165._8_4_ = auVar96._8_4_ * auVar126._8_4_;
          auVar165._12_4_ = auVar96._12_4_ * auVar126._12_4_;
          auVar165._16_4_ = auVar96._16_4_ * fVar151;
          auVar165._20_4_ = auVar96._20_4_ * fVar141;
          auVar165._24_4_ = auVar96._24_4_ * fVar149;
          auVar165._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar165,auVar102,auVar97);
          auVar103 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar88));
          auVar100 = vmulps_avx512vl(auVar101,auVar127);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar129);
          auVar68._4_4_ = auVar99._4_4_ * auVar129._4_4_;
          auVar68._0_4_ = auVar99._0_4_ * auVar129._0_4_;
          auVar68._8_4_ = auVar99._8_4_ * auVar129._8_4_;
          auVar68._12_4_ = auVar99._12_4_ * auVar129._12_4_;
          auVar68._16_4_ = auVar99._16_4_ * fVar169;
          auVar68._20_4_ = auVar99._20_4_ * fVar171;
          auVar68._24_4_ = auVar99._24_4_ * fVar156;
          auVar68._28_4_ = iVar3;
          auVar88 = vfmsub231ps_fma(auVar68,auVar128,auVar101);
          auVar166._0_4_ = auVar128._0_4_ * auVar98._0_4_;
          auVar166._4_4_ = auVar128._4_4_ * auVar98._4_4_;
          auVar166._8_4_ = auVar128._8_4_ * auVar98._8_4_;
          auVar166._12_4_ = auVar128._12_4_ * auVar98._12_4_;
          auVar166._16_4_ = fVar150 * auVar98._16_4_;
          auVar166._20_4_ = fVar170 * auVar98._20_4_;
          auVar166._24_4_ = fVar172 * auVar98._24_4_;
          auVar166._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar166,auVar99,auVar127);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,auVar100);
          auVar92 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar88));
          auVar100 = vmaxps_avx(auVar103,auVar92);
          uVar152 = vcmpps_avx512vl(auVar100,auVar106,2);
          bVar84 = bVar84 & (byte)uVar152;
          auVar94 = local_820;
          auVar95 = local_800;
          if (bVar84 == 0) goto LAB_019be0e9;
          auVar69._4_4_ = auVar101._4_4_ * auVar96._4_4_;
          auVar69._0_4_ = auVar101._0_4_ * auVar96._0_4_;
          auVar69._8_4_ = auVar101._8_4_ * auVar96._8_4_;
          auVar69._12_4_ = auVar101._12_4_ * auVar96._12_4_;
          auVar69._16_4_ = auVar101._16_4_ * auVar96._16_4_;
          auVar69._20_4_ = auVar101._20_4_ * auVar96._20_4_;
          auVar69._24_4_ = auVar101._24_4_ * auVar96._24_4_;
          auVar69._28_4_ = auVar100._28_4_;
          auVar86 = vfmsub231ps_fma(auVar69,auVar99,auVar97);
          auVar70._4_4_ = auVar97._4_4_ * auVar98._4_4_;
          auVar70._0_4_ = auVar97._0_4_ * auVar98._0_4_;
          auVar70._8_4_ = auVar97._8_4_ * auVar98._8_4_;
          auVar70._12_4_ = auVar97._12_4_ * auVar98._12_4_;
          auVar70._16_4_ = auVar97._16_4_ * auVar98._16_4_;
          auVar70._20_4_ = auVar97._20_4_ * auVar98._20_4_;
          auVar70._24_4_ = auVar97._24_4_ * auVar98._24_4_;
          auVar70._28_4_ = auVar97._28_4_;
          auVar87 = vfmsub231ps_fma(auVar70,auVar109,auVar101);
          auVar71._4_4_ = auVar99._4_4_ * auVar109._4_4_;
          auVar71._0_4_ = auVar99._0_4_ * auVar109._0_4_;
          auVar71._8_4_ = auVar99._8_4_ * auVar109._8_4_;
          auVar71._12_4_ = auVar99._12_4_ * auVar109._12_4_;
          auVar71._16_4_ = auVar99._16_4_ * auVar109._16_4_;
          auVar71._20_4_ = auVar99._20_4_ * auVar109._20_4_;
          auVar71._24_4_ = auVar99._24_4_ * auVar109._24_4_;
          auVar71._28_4_ = auVar99._28_4_;
          auVar7 = vfmsub231ps_fma(auVar71,auVar98,auVar96);
          auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar7));
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar86),auVar106);
          auVar96 = vrcp14ps_avx512vl(auVar100);
          auVar98 = auVar192._0_32_;
          auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar100,auVar98);
          auVar88 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
          auVar72._4_4_ = auVar7._4_4_ * auVar126._4_4_;
          auVar72._0_4_ = auVar7._0_4_ * auVar126._0_4_;
          auVar72._8_4_ = auVar7._8_4_ * auVar126._8_4_;
          auVar72._12_4_ = auVar7._12_4_ * auVar126._12_4_;
          auVar72._16_4_ = fVar151 * 0.0;
          auVar72._20_4_ = fVar141 * 0.0;
          auVar72._24_4_ = fVar149 * 0.0;
          auVar72._28_4_ = iVar2;
          auVar87 = vfmadd231ps_fma(auVar72,auVar102,ZEXT1632(auVar87));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar108,ZEXT1632(auVar86));
          fVar151 = auVar88._0_4_;
          fVar141 = auVar88._4_4_;
          fVar149 = auVar88._8_4_;
          fVar150 = auVar88._12_4_;
          local_5a0 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar150,
                                         CONCAT48(auVar87._8_4_ * fVar149,
                                                  CONCAT44(auVar87._4_4_ * fVar141,
                                                           auVar87._0_4_ * fVar151))));
          auVar75._4_4_ = uStack_65c;
          auVar75._0_4_ = local_660;
          auVar75._8_4_ = uStack_658;
          auVar75._12_4_ = uStack_654;
          auVar75._16_4_ = uStack_650;
          auVar75._20_4_ = uStack_64c;
          auVar75._24_4_ = uStack_648;
          auVar75._28_4_ = uStack_644;
          uVar152 = vcmpps_avx512vl(local_5a0,auVar75,0xd);
          uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar37._4_4_ = uVar142;
          auVar37._0_4_ = uVar142;
          auVar37._8_4_ = uVar142;
          auVar37._12_4_ = uVar142;
          auVar37._16_4_ = uVar142;
          auVar37._20_4_ = uVar142;
          auVar37._24_4_ = uVar142;
          auVar37._28_4_ = uVar142;
          uVar30 = vcmpps_avx512vl(local_5a0,auVar37,2);
          bVar84 = (byte)uVar152 & (byte)uVar30 & bVar84;
          if (bVar84 == 0) goto LAB_019be0e9;
          uVar152 = vcmpps_avx512vl(auVar100,auVar106,4);
          bVar84 = bVar84 & (byte)uVar152;
          auVar184 = ZEXT3264(local_800);
          auVar148 = ZEXT3264(local_820);
          if (bVar84 != 0) {
            fVar170 = auVar103._0_4_ * fVar151;
            fVar172 = auVar103._4_4_ * fVar141;
            auVar73._4_4_ = fVar172;
            auVar73._0_4_ = fVar170;
            fVar169 = auVar103._8_4_ * fVar149;
            auVar73._8_4_ = fVar169;
            fVar171 = auVar103._12_4_ * fVar150;
            auVar73._12_4_ = fVar171;
            fVar156 = auVar103._16_4_ * 0.0;
            auVar73._16_4_ = fVar156;
            fVar85 = auVar103._20_4_ * 0.0;
            auVar73._20_4_ = fVar85;
            fVar134 = auVar103._24_4_ * 0.0;
            auVar73._24_4_ = fVar134;
            auVar73._28_4_ = auVar100._28_4_;
            auVar96 = vsubps_avx512vl(auVar98,auVar73);
            local_5e0._0_4_ =
                 (float)((uint)(bVar77 & 1) * (int)fVar170 |
                        (uint)!(bool)(bVar77 & 1) * auVar96._0_4_);
            bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar14 * (int)fVar172 | (uint)!bVar14 * auVar96._4_4_);
            bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar96._8_4_);
            bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar14 * (int)fVar171 | (uint)!bVar14 * auVar96._12_4_)
            ;
            bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
            local_5e0._16_4_ = (float)((uint)bVar14 * (int)fVar156 | (uint)!bVar14 * auVar96._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
            local_5e0._20_4_ = (float)((uint)bVar14 * (int)fVar85 | (uint)!bVar14 * auVar96._20_4_);
            bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
            local_5e0._24_4_ = (float)((uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar96._24_4_)
            ;
            bVar14 = SUB81(uVar79 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar96._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar89),auVar93);
            auVar88 = vfmadd213ps_fma(auVar100,local_5e0,auVar93);
            uVar142 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar38._4_4_ = uVar142;
            auVar38._0_4_ = uVar142;
            auVar38._8_4_ = uVar142;
            auVar38._12_4_ = uVar142;
            auVar38._16_4_ = uVar142;
            auVar38._20_4_ = uVar142;
            auVar38._24_4_ = uVar142;
            auVar38._28_4_ = uVar142;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                          CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                   CONCAT44(auVar88._4_4_ +
                                                                            auVar88._4_4_,
                                                                            auVar88._0_4_ +
                                                                            auVar88._0_4_)))),
                                       auVar38);
            uVar152 = vcmpps_avx512vl(local_5a0,auVar100,6);
            if (((byte)uVar152 & bVar84) != 0) {
              auVar153._0_4_ = auVar92._0_4_ * fVar151;
              auVar153._4_4_ = auVar92._4_4_ * fVar141;
              auVar153._8_4_ = auVar92._8_4_ * fVar149;
              auVar153._12_4_ = auVar92._12_4_ * fVar150;
              auVar153._16_4_ = auVar92._16_4_ * 0.0;
              auVar153._20_4_ = auVar92._20_4_ * 0.0;
              auVar153._24_4_ = auVar92._24_4_ * 0.0;
              auVar153._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar98,auVar153);
              auVar131._0_4_ =
                   (uint)(bVar77 & 1) * (int)auVar153._0_4_ |
                   (uint)!(bool)(bVar77 & 1) * auVar100._0_4_;
              bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
              auVar131._4_4_ = (uint)bVar14 * (int)auVar153._4_4_ | (uint)!bVar14 * auVar100._4_4_;
              bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
              auVar131._8_4_ = (uint)bVar14 * (int)auVar153._8_4_ | (uint)!bVar14 * auVar100._8_4_;
              bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
              auVar131._12_4_ =
                   (uint)bVar14 * (int)auVar153._12_4_ | (uint)!bVar14 * auVar100._12_4_;
              bVar14 = (bool)((byte)(uVar79 >> 4) & 1);
              auVar131._16_4_ =
                   (uint)bVar14 * (int)auVar153._16_4_ | (uint)!bVar14 * auVar100._16_4_;
              bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
              auVar131._20_4_ =
                   (uint)bVar14 * (int)auVar153._20_4_ | (uint)!bVar14 * auVar100._20_4_;
              bVar14 = (bool)((byte)(uVar79 >> 6) & 1);
              auVar131._24_4_ =
                   (uint)bVar14 * (int)auVar153._24_4_ | (uint)!bVar14 * auVar100._24_4_;
              auVar131._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar100._28_4_;
              auVar39._8_4_ = 0x40000000;
              auVar39._0_8_ = 0x4000000040000000;
              auVar39._12_4_ = 0x40000000;
              auVar39._16_4_ = 0x40000000;
              auVar39._20_4_ = 0x40000000;
              auVar39._24_4_ = 0x40000000;
              auVar39._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar131,auVar98,auVar39);
              local_580 = (undefined4)lVar82;
              local_560 = local_7d0._0_8_;
              uStack_558 = local_7d0._8_8_;
              local_550 = local_7e0._0_8_;
              uStack_548 = local_7e0._8_8_;
              pGVar12 = (context->scene->geometries).items[uVar11].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                bVar77 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar77 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar88 = vcvtsi2ss_avx512f(auVar185._0_16_,local_580);
                fVar151 = auVar88._0_4_;
                local_520[0] = (fVar151 + local_5e0._0_4_ + 0.0) * (float)local_480._0_4_;
                local_520[1] = (fVar151 + local_5e0._4_4_ + 1.0) * (float)local_480._4_4_;
                local_520[2] = (fVar151 + local_5e0._8_4_ + 2.0) * fStack_478;
                local_520[3] = (fVar151 + local_5e0._12_4_ + 3.0) * fStack_474;
                fStack_510 = (fVar151 + local_5e0._16_4_ + 4.0) * fStack_470;
                fStack_50c = (fVar151 + local_5e0._20_4_ + 5.0) * fStack_46c;
                fStack_508 = (fVar151 + local_5e0._24_4_ + 6.0) * fStack_468;
                fStack_504 = fVar151 + local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                uVar79 = 0;
                uVar80 = (ulong)((byte)uVar152 & bVar84);
                for (uVar32 = uVar80; local_57c = iVar31, local_570 = auVar29, (uVar32 & 1) == 0;
                    uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                  uVar79 = uVar79 + 1;
                }
                while (auVar88 = auVar185._0_16_, uVar80 != 0) {
                  uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar79]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar79 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar79 * 4);
                  local_850.context = context->user;
                  fVar150 = local_200._0_4_;
                  fVar141 = 1.0 - fVar150;
                  fVar151 = fVar141 * fVar141 * -3.0;
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                            ZEXT416((uint)(fVar150 * fVar141)),ZEXT416(0xc0000000));
                  auVar89 = vfmsub132ss_fma(ZEXT416((uint)(fVar150 * fVar141)),
                                            ZEXT416((uint)(fVar150 * fVar150)),ZEXT416(0x40000000));
                  fVar141 = auVar88._0_4_ * 3.0;
                  fVar149 = auVar89._0_4_ * 3.0;
                  fVar150 = fVar150 * fVar150 * 3.0;
                  auVar168._0_4_ = fVar150 * (float)local_670._0_4_;
                  auVar168._4_4_ = fVar150 * (float)local_670._4_4_;
                  auVar168._8_4_ = fVar150 * fStack_668;
                  auVar168._12_4_ = fVar150 * fStack_664;
                  auVar145._4_4_ = fVar149;
                  auVar145._0_4_ = fVar149;
                  auVar145._8_4_ = fVar149;
                  auVar145._12_4_ = fVar149;
                  auVar88 = vfmadd132ps_fma(auVar145,auVar168,local_7e0);
                  auVar160._4_4_ = fVar141;
                  auVar160._0_4_ = fVar141;
                  auVar160._8_4_ = fVar141;
                  auVar160._12_4_ = fVar141;
                  auVar88 = vfmadd132ps_fma(auVar160,auVar88,local_7d0);
                  auVar146._4_4_ = fVar151;
                  auVar146._0_4_ = fVar151;
                  auVar146._8_4_ = fVar151;
                  auVar146._12_4_ = fVar151;
                  auVar88 = vfmadd213ps_fma(auVar146,auVar29,auVar88);
                  auVar148 = vbroadcastss_avx512f(auVar88);
                  auVar190 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar190,ZEXT1664(auVar88));
                  auVar190 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar190,ZEXT1664(auVar88));
                  local_2c0[0] = (RTCHitN)auVar148[0];
                  local_2c0[1] = (RTCHitN)auVar148[1];
                  local_2c0[2] = (RTCHitN)auVar148[2];
                  local_2c0[3] = (RTCHitN)auVar148[3];
                  local_2c0[4] = (RTCHitN)auVar148[4];
                  local_2c0[5] = (RTCHitN)auVar148[5];
                  local_2c0[6] = (RTCHitN)auVar148[6];
                  local_2c0[7] = (RTCHitN)auVar148[7];
                  local_2c0[8] = (RTCHitN)auVar148[8];
                  local_2c0[9] = (RTCHitN)auVar148[9];
                  local_2c0[10] = (RTCHitN)auVar148[10];
                  local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar148 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar148);
                  vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                  auVar148 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar148);
                  local_850.valid = (int *)local_640;
                  local_850.geometryUserPtr = pGVar12->userPtr;
                  local_850.hit = local_2c0;
                  local_850.N = 0x10;
                  local_850.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_850);
                    auVar148 = vmovdqa64_avx512f(local_640);
                  }
                  uVar152 = vptestmd_avx512f(auVar148,auVar148);
                  if ((short)uVar152 != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_850);
                      auVar148 = vmovdqa64_avx512f(local_640);
                    }
                    auVar88 = auVar185._0_16_;
                    uVar32 = vptestmd_avx512f(auVar148,auVar148);
                    auVar148 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar14 = (bool)((byte)uVar32 & 1);
                    auVar190._0_4_ =
                         (uint)bVar14 * auVar148._0_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x200);
                    bVar14 = (bool)((byte)(uVar32 >> 1) & 1);
                    auVar190._4_4_ =
                         (uint)bVar14 * auVar148._4_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x204);
                    bVar14 = (bool)((byte)(uVar32 >> 2) & 1);
                    auVar190._8_4_ =
                         (uint)bVar14 * auVar148._8_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x208);
                    bVar14 = (bool)((byte)(uVar32 >> 3) & 1);
                    auVar190._12_4_ =
                         (uint)bVar14 * auVar148._12_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x20c);
                    bVar14 = (bool)((byte)(uVar32 >> 4) & 1);
                    auVar190._16_4_ =
                         (uint)bVar14 * auVar148._16_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x210);
                    bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                    auVar190._20_4_ =
                         (uint)bVar14 * auVar148._20_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x214);
                    bVar14 = (bool)((byte)(uVar32 >> 6) & 1);
                    auVar190._24_4_ =
                         (uint)bVar14 * auVar148._24_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x218);
                    bVar14 = (bool)((byte)(uVar32 >> 7) & 1);
                    auVar190._28_4_ =
                         (uint)bVar14 * auVar148._28_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x21c);
                    bVar14 = (bool)((byte)(uVar32 >> 8) & 1);
                    auVar190._32_4_ =
                         (uint)bVar14 * auVar148._32_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x220);
                    bVar14 = (bool)((byte)(uVar32 >> 9) & 1);
                    auVar190._36_4_ =
                         (uint)bVar14 * auVar148._36_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x224);
                    bVar14 = (bool)((byte)(uVar32 >> 10) & 1);
                    auVar190._40_4_ =
                         (uint)bVar14 * auVar148._40_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x228);
                    bVar14 = (bool)((byte)(uVar32 >> 0xb) & 1);
                    auVar190._44_4_ =
                         (uint)bVar14 * auVar148._44_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x22c);
                    bVar14 = (bool)((byte)(uVar32 >> 0xc) & 1);
                    auVar190._48_4_ =
                         (uint)bVar14 * auVar148._48_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x230);
                    bVar14 = (bool)((byte)(uVar32 >> 0xd) & 1);
                    auVar190._52_4_ =
                         (uint)bVar14 * auVar148._52_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x234);
                    bVar14 = (bool)((byte)(uVar32 >> 0xe) & 1);
                    auVar190._56_4_ =
                         (uint)bVar14 * auVar148._56_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x238);
                    bVar14 = SUB81(uVar32 >> 0xf,0);
                    auVar190._60_4_ =
                         (uint)bVar14 * auVar148._60_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x23c);
                    *(undefined1 (*) [64])(local_850.ray + 0x200) = auVar190;
                    if ((short)uVar32 != 0) {
                      bVar77 = 1;
                      goto LAB_019be11a;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar142;
                  uVar32 = uVar79 & 0x3f;
                  uVar79 = 0;
                  uVar80 = uVar80 ^ 1L << uVar32;
                  for (uVar32 = uVar80; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000
                      ) {
                    uVar79 = uVar79 + 1;
                  }
                }
                bVar77 = 0;
LAB_019be11a:
                auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar192 = ZEXT3264(auVar100);
                auVar88 = vxorps_avx512vl(auVar88,auVar88);
                auVar185 = ZEXT1664(auVar88);
                auVar186 = ZEXT3264(local_6c0);
                auVar187 = ZEXT3264(local_6e0);
                auVar188 = ZEXT3264(local_700);
                auVar184 = ZEXT3264(local_800);
                auVar148 = ZEXT3264(local_820);
                auVar189 = ZEXT3264(local_780);
                auVar190 = ZEXT3264(local_7a0);
                auVar191 = ZEXT3264(local_7c0);
              }
              bVar76 = (bool)(bVar76 | bVar77);
            }
          }
        }
      }
    }
    if (bVar76) break;
    uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar36._4_4_ = uVar142;
    auVar36._0_4_ = uVar142;
    auVar36._8_4_ = uVar142;
    auVar36._12_4_ = uVar142;
    auVar36._16_4_ = uVar142;
    auVar36._20_4_ = uVar142;
    auVar36._24_4_ = uVar142;
    auVar36._28_4_ = uVar142;
    uVar152 = vcmpps_avx512vl(local_360,auVar36,2);
    local_728 = (ulong)((uint)uVar81 & (uint)uVar152);
  }
  return local_728 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }